

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::avx512::
     BVHNIntersectorKHybrid<8,_8,_1,_true,_embree::avx512::SubGridIntersectorKPluecker<8,_8,_true>,_true>
     ::occluded(vint<8> *valid_i,Intersectors *This,RayK<8> *ray,RayQueryContext *context)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  ushort uVar9;
  ushort uVar10;
  Geometry *pGVar11;
  long lVar12;
  RTCFilterFunctionN p_Var13;
  RTCRayQueryContext *pRVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  float fVar22;
  undefined1 auVar23 [32];
  ulong uVar24;
  undefined8 uVar25;
  undefined8 uVar26;
  undefined8 uVar27;
  size_t k;
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  byte bVar51;
  byte bVar52;
  byte bVar53;
  uint uVar54;
  int iVar55;
  ulong uVar56;
  byte bVar57;
  long lVar58;
  byte bVar59;
  long lVar60;
  long lVar61;
  uint *puVar62;
  ulong uVar63;
  long lVar64;
  RayK<8> *pRVar65;
  ulong *puVar66;
  long lVar67;
  undefined1 (*pauVar68) [32];
  NodeRef root;
  ulong uVar69;
  undefined4 uVar70;
  byte bVar71;
  uint uVar72;
  bool bVar73;
  ulong uVar74;
  undefined1 auVar75 [16];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  float fVar108;
  undefined1 auVar109 [16];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar127 [16];
  float fVar126;
  undefined1 auVar128 [16];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 in_ZMM2 [64];
  undefined1 auVar137 [64];
  undefined1 auVar138 [64];
  undefined1 auVar139 [64];
  undefined1 auVar140 [64];
  undefined1 in_ZMM9 [64];
  undefined1 auVar141 [64];
  undefined1 in_ZMM10 [64];
  undefined1 auVar142 [64];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [16];
  undefined1 auVar147 [64];
  undefined1 auVar148 [64];
  undefined1 auVar149 [64];
  undefined1 auVar150 [64];
  undefined1 in_ZMM27 [64];
  undefined1 auVar151 [64];
  undefined1 in_ZMM29 [64];
  undefined1 in_ZMM30 [64];
  Precalculations pre;
  vfloat<8> lower_y;
  vfloat<8> upper_y;
  vfloat<8> upper_z;
  vfloat<8> lower_z;
  TravRayK<8,_true> tray;
  vfloat<8> lower_x;
  vfloat<8> upper_x;
  NodeRef stack_node [561];
  vfloat<8> stack_near [561];
  Precalculations local_5f99;
  RayK<8> *local_5f98;
  RayQueryContext *local_5f90;
  long local_5f88;
  uint local_5f7c;
  long local_5f78;
  undefined1 (*local_5f70) [32];
  ulong *local_5f68;
  undefined1 local_5f60 [8];
  float fStack_5f58;
  float fStack_5f54;
  float fStack_5f50;
  float fStack_5f4c;
  float fStack_5f48;
  RayK<8> *local_5f38;
  ulong local_5f30;
  undefined4 local_5f24;
  undefined1 local_5f20 [32];
  RTCFilterFunctionNArguments local_5f00;
  undefined1 (*local_5ec8) [32];
  undefined1 local_5ec0 [32];
  undefined1 local_5ea0 [32];
  undefined1 local_5e80 [32];
  undefined1 local_5e60 [32];
  undefined1 local_5e40 [32];
  undefined1 local_5e20 [32];
  undefined1 local_5e00 [32];
  BVH *local_5dd0;
  Intersectors *local_5dc8;
  long local_5dc0;
  long local_5db8;
  long local_5db0;
  ulong local_5da8;
  undefined1 local_5da0 [32];
  undefined1 local_5d80 [32];
  undefined1 local_5d60 [32];
  undefined1 local_5d40 [32];
  undefined1 local_5d20 [32];
  undefined1 local_5d00 [16];
  undefined1 local_5cf0 [16];
  undefined1 local_5ce0 [32];
  undefined1 local_5cc0 [32];
  anon_union_96_2_4062524c_for_Vec3<embree::vfloat_impl<8>_>_1 local_5ca0;
  undefined1 local_5c40 [32];
  undefined1 local_5c20 [32];
  undefined1 local_5c00 [32];
  undefined1 local_5be0 [8];
  float fStack_5bd8;
  float fStack_5bd4;
  float fStack_5bd0;
  float fStack_5bcc;
  float fStack_5bc8;
  undefined1 local_5bc0 [8];
  float fStack_5bb8;
  float fStack_5bb4;
  float fStack_5bb0;
  float fStack_5bac;
  float fStack_5ba8;
  undefined1 local_5ba0 [8];
  float fStack_5b98;
  float fStack_5b94;
  float fStack_5b90;
  float fStack_5b8c;
  float fStack_5b88;
  int local_5b80;
  int iStack_5b7c;
  int iStack_5b78;
  int iStack_5b74;
  int iStack_5b70;
  int iStack_5b6c;
  int iStack_5b68;
  int iStack_5b64;
  uint local_5b60;
  uint uStack_5b5c;
  uint uStack_5b58;
  uint uStack_5b54;
  uint uStack_5b50;
  uint uStack_5b4c;
  uint uStack_5b48;
  uint uStack_5b44;
  uint local_5b40;
  uint uStack_5b3c;
  uint uStack_5b38;
  uint uStack_5b34;
  uint uStack_5b30;
  uint uStack_5b2c;
  uint uStack_5b28;
  uint uStack_5b24;
  undefined1 local_5b20 [32];
  undefined1 local_5b00 [32];
  RTCHitN local_5ae0 [32];
  undefined1 local_5ac0 [32];
  undefined1 local_5aa0 [32];
  undefined1 local_5a80 [32];
  undefined1 local_5a60 [32];
  undefined1 local_5a40 [32];
  undefined1 local_5a20 [32];
  uint local_5a00;
  uint uStack_59fc;
  uint uStack_59f8;
  uint uStack_59f4;
  uint uStack_59f0;
  uint uStack_59ec;
  uint uStack_59e8;
  uint uStack_59e4;
  uint local_59e0;
  uint uStack_59dc;
  uint uStack_59d8;
  uint uStack_59d4;
  uint uStack_59d0;
  uint uStack_59cc;
  uint uStack_59c8;
  uint uStack_59c4;
  undefined1 local_59c0 [32];
  undefined8 local_59a0;
  undefined8 uStack_5998;
  undefined8 local_5990;
  undefined8 uStack_5988;
  undefined8 local_5980;
  undefined8 uStack_5978;
  undefined8 local_5970;
  undefined8 uStack_5968;
  undefined8 local_5960;
  undefined8 uStack_5958;
  undefined8 local_5950;
  undefined8 uStack_5948;
  undefined8 local_5940;
  undefined8 uStack_5938;
  undefined8 local_5930;
  undefined8 uStack_5928;
  undefined8 local_5920;
  undefined8 uStack_5918;
  undefined8 local_5910;
  undefined8 uStack_5908;
  undefined8 local_5900;
  undefined8 uStack_58f8;
  undefined8 local_58f0;
  undefined8 uStack_58e8;
  undefined8 local_58e0;
  undefined8 uStack_58d8;
  undefined8 local_58d0;
  undefined8 uStack_58c8;
  uint local_58c0;
  uint uStack_58bc;
  uint uStack_58b8;
  uint uStack_58b4;
  uint uStack_58b0;
  uint uStack_58ac;
  uint uStack_58a8;
  uint uStack_58a4;
  uint local_58a0;
  uint uStack_589c;
  uint uStack_5898;
  uint uStack_5894;
  uint uStack_5890;
  uint uStack_588c;
  uint uStack_5888;
  uint uStack_5884;
  uint local_5880;
  uint uStack_587c;
  uint uStack_5878;
  uint uStack_5874;
  uint uStack_5870;
  uint uStack_586c;
  uint uStack_5868;
  uint uStack_5864;
  undefined1 local_5860 [32];
  undefined1 local_5840 [32];
  undefined8 local_5810;
  size_t local_5808;
  ulong local_5800 [560];
  undefined1 local_4680 [32];
  undefined1 local_4660 [32];
  undefined1 local_4640 [17936];
  
  local_5dd0 = (BVH *)This->ptr;
  if ((local_5dd0->root).ptr != 8) {
    if ((context->user == (RTCRayQueryContext *)0x0) ||
       ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) == RTC_RAY_QUERY_FLAG_INCOHERENT)) {
      auVar77 = vpcmpeqd_avx2(in_ZMM2._0_32_,in_ZMM2._0_32_);
      auVar109 = ZEXT816(0) << 0x40;
      uVar74 = vcmpps_avx512vl(*(undefined1 (*) [32])(ray + 0x100),ZEXT1632(auVar109),5);
      uVar69 = vpcmpeqd_avx512vl(auVar77,(undefined1  [32])valid_i->field_0);
      uVar74 = uVar74 & uVar69;
      bVar53 = (byte)uVar74;
      if (bVar53 != 0) {
        local_5dc8 = This;
        local_5ca0._0_8_ = *(undefined8 *)ray;
        local_5ca0._8_8_ = *(undefined8 *)(ray + 8);
        local_5ca0._16_8_ = *(undefined8 *)(ray + 0x10);
        local_5ca0._24_8_ = *(undefined8 *)(ray + 0x18);
        local_5ca0._32_8_ = *(undefined8 *)(ray + 0x20);
        local_5ca0._40_8_ = *(undefined8 *)(ray + 0x28);
        local_5ca0._48_8_ = *(undefined8 *)(ray + 0x30);
        local_5ca0._56_8_ = *(undefined8 *)(ray + 0x38);
        local_5ca0._64_8_ = *(undefined8 *)(ray + 0x40);
        local_5ca0._72_8_ = *(undefined8 *)(ray + 0x48);
        local_5ca0._80_8_ = *(undefined8 *)(ray + 0x50);
        local_5ca0._88_8_ = *(undefined8 *)(ray + 0x58);
        local_5c40 = *(undefined1 (*) [32])(ray + 0x80);
        local_5c20 = *(undefined1 (*) [32])(ray + 0xa0);
        local_5c00 = *(undefined1 (*) [32])(ray + 0xc0);
        auVar76 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
        auVar147 = ZEXT3264(auVar76);
        vandps_avx512vl(local_5c40,auVar76);
        auVar94._8_4_ = 0x219392ef;
        auVar94._0_8_ = 0x219392ef219392ef;
        auVar94._12_4_ = 0x219392ef;
        auVar94._16_4_ = 0x219392ef;
        auVar94._20_4_ = 0x219392ef;
        auVar94._24_4_ = 0x219392ef;
        auVar94._28_4_ = 0x219392ef;
        uVar69 = vcmpps_avx512vl(auVar76,auVar94,1);
        auVar95._8_4_ = 0x3f800000;
        auVar95._0_8_ = &DAT_3f8000003f800000;
        auVar95._12_4_ = 0x3f800000;
        auVar95._16_4_ = 0x3f800000;
        auVar95._20_4_ = 0x3f800000;
        auVar95._24_4_ = 0x3f800000;
        auVar95._28_4_ = 0x3f800000;
        auVar139 = ZEXT3264(auVar95);
        auVar77 = vdivps_avx(auVar95,local_5c40);
        vandps_avx512vl(local_5c20,auVar76);
        uVar63 = vcmpps_avx512vl(auVar76,auVar94,1);
        auVar78 = vdivps_avx(auVar95,local_5c20);
        vandps_avx512vl(local_5c00,auVar76);
        uVar56 = vcmpps_avx512vl(auVar76,auVar94,1);
        auVar76 = vdivps_avx(auVar95,local_5c00);
        auVar137 = ZEXT3264(CONCAT428(0x5d5e0b6b,
                                      CONCAT424(0x5d5e0b6b,
                                                CONCAT420(0x5d5e0b6b,
                                                          CONCAT416(0x5d5e0b6b,
                                                                    CONCAT412(0x5d5e0b6b,
                                                                              CONCAT48(0x5d5e0b6b,
                                                                                                                                                                              
                                                  0x5d5e0b6b5d5e0b6b)))))));
        bVar73 = (bool)((byte)uVar69 & 1);
        local_5be0._0_4_ = (uint)bVar73 * 0x5d5e0b6b | (uint)!bVar73 * auVar77._0_4_;
        bVar73 = (bool)((byte)(uVar69 >> 1) & 1);
        local_5be0._4_4_ = (uint)bVar73 * 0x5d5e0b6b | (uint)!bVar73 * auVar77._4_4_;
        bVar73 = (bool)((byte)(uVar69 >> 2) & 1);
        fStack_5bd8 = (float)((uint)bVar73 * 0x5d5e0b6b | (uint)!bVar73 * auVar77._8_4_);
        bVar73 = (bool)((byte)(uVar69 >> 3) & 1);
        fStack_5bd4 = (float)((uint)bVar73 * 0x5d5e0b6b | (uint)!bVar73 * auVar77._12_4_);
        bVar73 = (bool)((byte)(uVar69 >> 4) & 1);
        fStack_5bd0 = (float)((uint)bVar73 * 0x5d5e0b6b | (uint)!bVar73 * auVar77._16_4_);
        bVar73 = (bool)((byte)(uVar69 >> 5) & 1);
        fStack_5bcc = (float)((uint)bVar73 * 0x5d5e0b6b | (uint)!bVar73 * auVar77._20_4_);
        bVar73 = (bool)((byte)(uVar69 >> 6) & 1);
        fStack_5bc8 = (float)((uint)bVar73 * 0x5d5e0b6b | (uint)!bVar73 * auVar77._24_4_);
        bVar73 = SUB81(uVar69 >> 7,0);
        register0x00000918 = (uint)bVar73 * 0x5d5e0b6b | (uint)!bVar73 * auVar77._28_4_;
        bVar73 = (bool)((byte)uVar63 & 1);
        local_5bc0._0_4_ = (uint)bVar73 * 0x5d5e0b6b | (uint)!bVar73 * auVar78._0_4_;
        bVar73 = (bool)((byte)(uVar63 >> 1) & 1);
        local_5bc0._4_4_ = (uint)bVar73 * 0x5d5e0b6b | (uint)!bVar73 * auVar78._4_4_;
        bVar73 = (bool)((byte)(uVar63 >> 2) & 1);
        fStack_5bb8 = (float)((uint)bVar73 * 0x5d5e0b6b | (uint)!bVar73 * auVar78._8_4_);
        bVar73 = (bool)((byte)(uVar63 >> 3) & 1);
        fStack_5bb4 = (float)((uint)bVar73 * 0x5d5e0b6b | (uint)!bVar73 * auVar78._12_4_);
        bVar73 = (bool)((byte)(uVar63 >> 4) & 1);
        fStack_5bb0 = (float)((uint)bVar73 * 0x5d5e0b6b | (uint)!bVar73 * auVar78._16_4_);
        bVar73 = (bool)((byte)(uVar63 >> 5) & 1);
        fStack_5bac = (float)((uint)bVar73 * 0x5d5e0b6b | (uint)!bVar73 * auVar78._20_4_);
        bVar73 = (bool)((byte)(uVar63 >> 6) & 1);
        fStack_5ba8 = (float)((uint)bVar73 * 0x5d5e0b6b | (uint)!bVar73 * auVar78._24_4_);
        bVar73 = SUB81(uVar63 >> 7,0);
        register0x00000918 = (uint)bVar73 * 0x5d5e0b6b | (uint)!bVar73 * auVar78._28_4_;
        bVar73 = (bool)((byte)uVar56 & 1);
        local_5ba0._0_4_ = (uint)bVar73 * 0x5d5e0b6b | (uint)!bVar73 * auVar76._0_4_;
        bVar73 = (bool)((byte)(uVar56 >> 1) & 1);
        local_5ba0._4_4_ = (uint)bVar73 * 0x5d5e0b6b | (uint)!bVar73 * auVar76._4_4_;
        bVar73 = (bool)((byte)(uVar56 >> 2) & 1);
        fStack_5b98 = (float)((uint)bVar73 * 0x5d5e0b6b | (uint)!bVar73 * auVar76._8_4_);
        bVar73 = (bool)((byte)(uVar56 >> 3) & 1);
        fStack_5b94 = (float)((uint)bVar73 * 0x5d5e0b6b | (uint)!bVar73 * auVar76._12_4_);
        bVar73 = (bool)((byte)(uVar56 >> 4) & 1);
        fStack_5b90 = (float)((uint)bVar73 * 0x5d5e0b6b | (uint)!bVar73 * auVar76._16_4_);
        bVar73 = (bool)((byte)(uVar56 >> 5) & 1);
        fStack_5b8c = (float)((uint)bVar73 * 0x5d5e0b6b | (uint)!bVar73 * auVar76._20_4_);
        bVar73 = (bool)((byte)(uVar56 >> 6) & 1);
        fStack_5b88 = (float)((uint)bVar73 * 0x5d5e0b6b | (uint)!bVar73 * auVar76._24_4_);
        bVar73 = SUB81(uVar56 >> 7,0);
        register0x00000918 = (uint)bVar73 * 0x5d5e0b6b | (uint)!bVar73 * auVar76._28_4_;
        uVar69 = vcmpps_avx512vl(_local_5be0,ZEXT1632(auVar109),1);
        auVar77 = vpbroadcastd_avx512vl(ZEXT416(0x20));
        local_5b80 = (uint)((byte)uVar69 & 1) * auVar77._0_4_;
        iStack_5b7c = (uint)((byte)(uVar69 >> 1) & 1) * auVar77._4_4_;
        iStack_5b78 = (uint)((byte)(uVar69 >> 2) & 1) * auVar77._8_4_;
        iStack_5b74 = (uint)((byte)(uVar69 >> 3) & 1) * auVar77._12_4_;
        iStack_5b70 = (uint)((byte)(uVar69 >> 4) & 1) * auVar77._16_4_;
        iStack_5b6c = (uint)((byte)(uVar69 >> 5) & 1) * auVar77._20_4_;
        iStack_5b68 = (uint)((byte)(uVar69 >> 6) & 1) * auVar77._24_4_;
        iStack_5b64 = (uint)(byte)(uVar69 >> 7) * auVar77._28_4_;
        auVar78 = ZEXT1632(auVar109);
        uVar69 = vcmpps_avx512vl(_local_5bc0,auVar78,5);
        auVar77 = vpbroadcastd_avx512vl(ZEXT416(0x40));
        bVar73 = (bool)((byte)uVar69 & 1);
        bVar15 = (bool)((byte)(uVar69 >> 1) & 1);
        bVar16 = (bool)((byte)(uVar69 >> 2) & 1);
        bVar17 = (bool)((byte)(uVar69 >> 3) & 1);
        bVar18 = (bool)((byte)(uVar69 >> 4) & 1);
        bVar19 = (bool)((byte)(uVar69 >> 5) & 1);
        bVar20 = (bool)((byte)(uVar69 >> 6) & 1);
        bVar21 = SUB81(uVar69 >> 7,0);
        local_5b60 = (uint)bVar73 * auVar77._0_4_ | (uint)!bVar73 * 0x60;
        uStack_5b5c = (uint)bVar15 * auVar77._4_4_ | (uint)!bVar15 * 0x60;
        uStack_5b58 = (uint)bVar16 * auVar77._8_4_ | (uint)!bVar16 * 0x60;
        uStack_5b54 = (uint)bVar17 * auVar77._12_4_ | (uint)!bVar17 * 0x60;
        uStack_5b50 = (uint)bVar18 * auVar77._16_4_ | (uint)!bVar18 * 0x60;
        uStack_5b4c = (uint)bVar19 * auVar77._20_4_ | (uint)!bVar19 * 0x60;
        uStack_5b48 = (uint)bVar20 * auVar77._24_4_ | (uint)!bVar20 * 0x60;
        uStack_5b44 = (uint)bVar21 * auVar77._28_4_ | (uint)!bVar21 * 0x60;
        uVar69 = vcmpps_avx512vl(_local_5ba0,auVar78,5);
        auVar77 = vpbroadcastd_avx512vl(ZEXT416(0x80));
        bVar73 = (bool)((byte)uVar69 & 1);
        bVar15 = (bool)((byte)(uVar69 >> 1) & 1);
        bVar16 = (bool)((byte)(uVar69 >> 2) & 1);
        bVar17 = (bool)((byte)(uVar69 >> 3) & 1);
        bVar18 = (bool)((byte)(uVar69 >> 4) & 1);
        bVar19 = (bool)((byte)(uVar69 >> 5) & 1);
        bVar20 = (bool)((byte)(uVar69 >> 6) & 1);
        bVar21 = SUB81(uVar69 >> 7,0);
        local_5b40 = (uint)bVar73 * auVar77._0_4_ | (uint)!bVar73 * 0xa0;
        uStack_5b3c = (uint)bVar15 * auVar77._4_4_ | (uint)!bVar15 * 0xa0;
        uStack_5b38 = (uint)bVar16 * auVar77._8_4_ | (uint)!bVar16 * 0xa0;
        uStack_5b34 = (uint)bVar17 * auVar77._12_4_ | (uint)!bVar17 * 0xa0;
        uStack_5b30 = (uint)bVar18 * auVar77._16_4_ | (uint)!bVar18 * 0xa0;
        uStack_5b2c = (uint)bVar19 * auVar77._20_4_ | (uint)!bVar19 * 0xa0;
        uStack_5b28 = (uint)bVar20 * auVar77._24_4_ | (uint)!bVar20 * 0xa0;
        uStack_5b24 = (uint)bVar21 * auVar77._28_4_ | (uint)!bVar21 * 0xa0;
        local_4680 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar148 = ZEXT3264(local_4680);
        auVar77 = vmaxps_avx512vl(*(undefined1 (*) [32])(ray + 0x60),auVar78);
        local_5b20._0_4_ =
             (uint)(bVar53 & 1) * auVar77._0_4_ | (uint)!(bool)(bVar53 & 1) * local_4680._0_4_;
        bVar73 = (bool)((byte)(uVar74 >> 1) & 1);
        local_5b20._4_4_ = (uint)bVar73 * auVar77._4_4_ | (uint)!bVar73 * local_4680._4_4_;
        bVar73 = (bool)((byte)(uVar74 >> 2) & 1);
        local_5b20._8_4_ = (uint)bVar73 * auVar77._8_4_ | (uint)!bVar73 * local_4680._8_4_;
        bVar73 = (bool)((byte)(uVar74 >> 3) & 1);
        local_5b20._12_4_ = (uint)bVar73 * auVar77._12_4_ | (uint)!bVar73 * local_4680._12_4_;
        bVar73 = (bool)((byte)(uVar74 >> 4) & 1);
        local_5b20._16_4_ = (uint)bVar73 * auVar77._16_4_ | (uint)!bVar73 * local_4680._16_4_;
        bVar73 = (bool)((byte)(uVar74 >> 5) & 1);
        local_5b20._20_4_ = (uint)bVar73 * auVar77._20_4_ | (uint)!bVar73 * local_4680._20_4_;
        bVar73 = (bool)((byte)(uVar74 >> 6) & 1);
        local_5b20._24_4_ = (uint)bVar73 * auVar77._24_4_ | (uint)!bVar73 * local_4680._24_4_;
        bVar73 = SUB81(uVar74 >> 7,0);
        local_5b20._28_4_ = (uint)bVar73 * auVar77._28_4_ | (uint)!bVar73 * local_4680._28_4_;
        local_5f24 = (undefined4)uVar74;
        auVar77 = vmaxps_avx512vl(*(undefined1 (*) [32])(ray + 0x100),auVar78);
        bVar73 = (bool)((byte)(uVar74 >> 1) & 1);
        bVar15 = (bool)((byte)(uVar74 >> 2) & 1);
        bVar16 = (bool)((byte)(uVar74 >> 3) & 1);
        bVar17 = (bool)((byte)(uVar74 >> 4) & 1);
        bVar18 = (bool)((byte)(uVar74 >> 5) & 1);
        bVar19 = (bool)((byte)(uVar74 >> 6) & 1);
        bVar20 = SUB81(uVar74 >> 7,0);
        local_5b00._4_4_ = (uint)bVar73 * auVar77._4_4_ | (uint)!bVar73 * -0x800000;
        local_5b00._0_4_ =
             (uint)(bVar53 & 1) * auVar77._0_4_ | (uint)!(bool)(bVar53 & 1) * -0x800000;
        local_5b00._8_4_ = (uint)bVar15 * auVar77._8_4_ | (uint)!bVar15 * -0x800000;
        local_5b00._12_4_ = (uint)bVar16 * auVar77._12_4_ | (uint)!bVar16 * -0x800000;
        local_5b00._16_4_ = (uint)bVar17 * auVar77._16_4_ | (uint)!bVar17 * -0x800000;
        local_5b00._20_4_ = (uint)bVar18 * auVar77._20_4_ | (uint)!bVar18 * -0x800000;
        local_5b00._24_4_ = (uint)bVar19 * auVar77._24_4_ | (uint)!bVar19 * -0x800000;
        local_5b00._28_4_ = (uint)bVar20 * auVar77._28_4_ | (uint)!bVar20 * -0x800000;
        bVar53 = ~bVar53;
        if (context->user == (RTCRayQueryContext *)0x0) {
          uVar74 = 7;
        }
        else {
          uVar74 = (ulong)((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                          RTC_RAY_QUERY_FLAG_INCOHERENT) * 5 + 2;
        }
        local_5f38 = ray + 0x100;
        puVar66 = local_5800;
        local_5810 = 0xfffffffffffffff8;
        pauVar68 = (undefined1 (*) [32])local_4640;
        local_5808 = (local_5dd0->root).ptr;
        local_4660 = local_5b20;
        local_5ec8 = (undefined1 (*) [32])&local_5a00;
        auVar77 = vbroadcastss_avx512vl(ZEXT416(0x3f7ffffa));
        auVar149 = ZEXT3264(auVar77);
        auVar77 = vbroadcastss_avx512vl(ZEXT416(0x3f800003));
        auVar150 = ZEXT3264(auVar77);
        auVar77 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
        auVar151 = ZEXT3264(auVar77);
        local_5f98 = ray;
        local_5f90 = context;
        local_5f30 = uVar74;
        do {
          pauVar68 = pauVar68 + -1;
          root.ptr = puVar66[-1];
          puVar66 = puVar66 + -1;
          if (root.ptr == 0xfffffffffffffff8) {
LAB_0088e097:
            iVar55 = 3;
          }
          else {
            local_5e60 = *pauVar68;
            uVar69 = vcmpps_avx512vl(local_5e60,local_5b00,1);
            if ((char)uVar69 == '\0') {
LAB_0088e0a8:
              iVar55 = 2;
            }
            else {
              uVar70 = (undefined4)uVar69;
              iVar55 = 0;
              if ((uint)POPCOUNT(uVar70) <= uVar74) {
                local_5e40 = in_ZMM10._0_32_;
                local_5e20 = in_ZMM27._0_32_;
                local_5e00 = in_ZMM29._0_32_;
                _local_5f60 = in_ZMM30._0_32_;
                local_5f70 = pauVar68;
                local_5f68 = puVar66;
                do {
                  k = 0;
                  for (uVar74 = uVar69; (uVar74 & 1) == 0; uVar74 = uVar74 >> 1 | 0x8000000000000000
                      ) {
                    k = k + 1;
                  }
                  auVar137 = ZEXT1664(auVar137._0_16_);
                  auVar139 = ZEXT1664(auVar139._0_16_);
                  in_ZMM9 = ZEXT1664(in_ZMM9._0_16_);
                  bVar73 = occluded1(local_5dc8,local_5dd0,root,k,&local_5f99,local_5f98,
                                     (TravRayK<8,_true> *)&local_5ca0.field_0,context);
                  bVar59 = (byte)(1 << ((uint)k & 0x1f));
                  if (!bVar73) {
                    bVar59 = 0;
                  }
                  bVar53 = bVar53 | bVar59;
                  uVar69 = uVar69 - 1 & uVar69;
                  context = local_5f90;
                } while (uVar69 != 0);
                if (bVar53 == 0xff) {
                  iVar55 = 3;
                }
                else {
                  auVar77 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                  local_5b00._0_4_ =
                       (uint)(bVar53 & 1) * auVar77._0_4_ |
                       (uint)!(bool)(bVar53 & 1) * local_5b00._0_4_;
                  bVar73 = (bool)(bVar53 >> 1 & 1);
                  local_5b00._4_4_ = (uint)bVar73 * auVar77._4_4_ | (uint)!bVar73 * local_5b00._4_4_
                  ;
                  bVar73 = (bool)(bVar53 >> 2 & 1);
                  local_5b00._8_4_ = (uint)bVar73 * auVar77._8_4_ | (uint)!bVar73 * local_5b00._8_4_
                  ;
                  bVar73 = (bool)(bVar53 >> 3 & 1);
                  local_5b00._12_4_ =
                       (uint)bVar73 * auVar77._12_4_ | (uint)!bVar73 * local_5b00._12_4_;
                  bVar73 = (bool)(bVar53 >> 4 & 1);
                  local_5b00._16_4_ =
                       (uint)bVar73 * auVar77._16_4_ | (uint)!bVar73 * local_5b00._16_4_;
                  bVar73 = (bool)(bVar53 >> 5 & 1);
                  local_5b00._20_4_ =
                       (uint)bVar73 * auVar77._20_4_ | (uint)!bVar73 * local_5b00._20_4_;
                  bVar73 = (bool)(bVar53 >> 6 & 1);
                  local_5b00._24_4_ =
                       (uint)bVar73 * auVar77._24_4_ | (uint)!bVar73 * local_5b00._24_4_;
                  local_5b00._28_4_ =
                       (uint)(bVar53 >> 7) * auVar77._28_4_ |
                       (uint)!(bool)(bVar53 >> 7) * local_5b00._28_4_;
                  iVar55 = 2;
                }
                auVar77 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                auVar147 = ZEXT3264(auVar77);
                auVar77 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                auVar148 = ZEXT3264(auVar77);
                auVar77 = vbroadcastss_avx512vl(ZEXT416(0x3f7ffffa));
                auVar149 = ZEXT3264(auVar77);
                auVar77 = vbroadcastss_avx512vl(ZEXT416(0x3f800003));
                auVar150 = ZEXT3264(auVar77);
                auVar77 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                auVar151 = ZEXT3264(auVar77);
                in_ZMM30 = ZEXT3264(_local_5f60);
                in_ZMM29 = ZEXT3264(local_5e00);
                in_ZMM27 = ZEXT3264(local_5e20);
                in_ZMM10 = ZEXT3264(local_5e40);
                uVar74 = local_5f30;
                puVar66 = local_5f68;
                pauVar68 = local_5f70;
              }
              auVar142 = ZEXT3264(local_5e60);
              if ((uint)uVar74 < (uint)POPCOUNT(uVar70)) {
                do {
                  if ((root.ptr & 8) != 0) {
                    if (root.ptr == 0xfffffffffffffff8) goto LAB_0088e097;
                    uVar25 = vcmpps_avx512vl(auVar142._0_32_,local_5b00,9);
                    if ((char)uVar25 != '\0') {
                      local_5dc0 = (ulong)((uint)root.ptr & 0xf) - 8;
                      bVar59 = bVar53;
                      if (local_5dc0 != 0) {
                        uVar69 = root.ptr & 0xfffffffffffffff0;
                        bVar59 = ~bVar53;
                        lVar60 = 0;
                        local_5f70 = pauVar68;
                        local_5f68 = puVar66;
                        do {
                          local_5db8 = lVar60;
                          lVar60 = lVar60 * 0x90;
                          auVar109._8_8_ = 0;
                          auVar109._0_8_ = *(ulong *)(uVar69 + 0x40 + lVar60);
                          auVar75._8_8_ = 0;
                          auVar75._0_8_ = *(ulong *)(uVar69 + 0x48 + lVar60);
                          uVar63 = vpcmpub_avx512vl(auVar109,auVar75,2);
                          if ((char)uVar63 != '\0') {
                            lVar60 = lVar60 + uVar69;
                            uVar63 = uVar63 & 0xff;
                            local_5db0 = lVar60;
                            do {
                              auVar146._8_8_ = 0;
                              auVar146._0_8_ = *(ulong *)(lVar60 + 0x40);
                              auVar77 = vpmovzxbd_avx2(auVar146);
                              auVar77 = vcvtdq2ps_avx(auVar77);
                              uVar70 = *(undefined4 *)(lVar60 + 0x7c);
                              auVar78._4_4_ = uVar70;
                              auVar78._0_4_ = uVar70;
                              auVar78._8_4_ = uVar70;
                              auVar78._12_4_ = uVar70;
                              auVar78._16_4_ = uVar70;
                              auVar78._20_4_ = uVar70;
                              auVar78._24_4_ = uVar70;
                              auVar78._28_4_ = uVar70;
                              uVar70 = *(undefined4 *)(lVar60 + 0x70);
                              auVar129._4_4_ = uVar70;
                              auVar129._0_4_ = uVar70;
                              auVar129._8_4_ = uVar70;
                              auVar129._12_4_ = uVar70;
                              auVar129._16_4_ = uVar70;
                              auVar129._20_4_ = uVar70;
                              auVar129._24_4_ = uVar70;
                              auVar129._28_4_ = uVar70;
                              auVar109 = vfmadd213ps_fma(auVar77,auVar78,auVar129);
                              auVar77 = ZEXT1632(auVar109);
                              local_5ae0[0] = (RTCHitN)auVar77[0];
                              local_5ae0[1] = (RTCHitN)auVar77[1];
                              local_5ae0[2] = (RTCHitN)auVar77[2];
                              local_5ae0[3] = (RTCHitN)auVar77[3];
                              local_5ae0[4] = (RTCHitN)auVar77[4];
                              local_5ae0[5] = (RTCHitN)auVar77[5];
                              local_5ae0[6] = (RTCHitN)auVar77[6];
                              local_5ae0[7] = (RTCHitN)auVar77[7];
                              local_5ae0[8] = (RTCHitN)auVar77[8];
                              local_5ae0[9] = (RTCHitN)auVar77[9];
                              local_5ae0[10] = (RTCHitN)auVar77[10];
                              local_5ae0[0xb] = (RTCHitN)auVar77[0xb];
                              local_5ae0[0xc] = (RTCHitN)auVar77[0xc];
                              local_5ae0[0xd] = (RTCHitN)auVar77[0xd];
                              local_5ae0[0xe] = (RTCHitN)auVar77[0xe];
                              local_5ae0[0xf] = (RTCHitN)auVar77[0xf];
                              local_5ae0[0x10] = (RTCHitN)auVar77[0x10];
                              local_5ae0[0x11] = (RTCHitN)auVar77[0x11];
                              local_5ae0[0x12] = (RTCHitN)auVar77[0x12];
                              local_5ae0[0x13] = (RTCHitN)auVar77[0x13];
                              local_5ae0[0x14] = (RTCHitN)auVar77[0x14];
                              local_5ae0[0x15] = (RTCHitN)auVar77[0x15];
                              local_5ae0[0x16] = (RTCHitN)auVar77[0x16];
                              local_5ae0[0x17] = (RTCHitN)auVar77[0x17];
                              local_5ae0[0x18] = (RTCHitN)auVar77[0x18];
                              local_5ae0[0x19] = (RTCHitN)auVar77[0x19];
                              local_5ae0[0x1a] = (RTCHitN)auVar77[0x1a];
                              local_5ae0[0x1b] = (RTCHitN)auVar77[0x1b];
                              local_5ae0[0x1c] = (RTCHitN)auVar77[0x1c];
                              local_5ae0[0x1d] = (RTCHitN)auVar77[0x1d];
                              local_5ae0[0x1e] = (RTCHitN)auVar77[0x1e];
                              local_5ae0[0x1f] = (RTCHitN)auVar77[0x1f];
                              auVar4._8_8_ = 0;
                              auVar4._0_8_ = *(ulong *)(lVar60 + 0x48);
                              auVar77 = vpmovzxbd_avx2(auVar4);
                              auVar77 = vcvtdq2ps_avx(auVar77);
                              auVar109 = vfmadd213ps_fma(auVar77,auVar78,auVar129);
                              local_59c0 = ZEXT1632(auVar109);
                              auVar5._8_8_ = 0;
                              auVar5._0_8_ = *(ulong *)(lVar60 + 0x50);
                              auVar77 = vpmovzxbd_avx2(auVar5);
                              uVar70 = *(undefined4 *)(lVar60 + 0x80);
                              auVar76._4_4_ = uVar70;
                              auVar76._0_4_ = uVar70;
                              auVar76._8_4_ = uVar70;
                              auVar76._12_4_ = uVar70;
                              auVar76._16_4_ = uVar70;
                              auVar76._20_4_ = uVar70;
                              auVar76._24_4_ = uVar70;
                              auVar76._28_4_ = uVar70;
                              auVar77 = vcvtdq2ps_avx(auVar77);
                              uVar70 = *(undefined4 *)(lVar60 + 0x74);
                              auVar130._4_4_ = uVar70;
                              auVar130._0_4_ = uVar70;
                              auVar130._8_4_ = uVar70;
                              auVar130._12_4_ = uVar70;
                              auVar130._16_4_ = uVar70;
                              auVar130._20_4_ = uVar70;
                              auVar130._24_4_ = uVar70;
                              auVar130._28_4_ = uVar70;
                              auVar109 = vfmadd213ps_fma(auVar77,auVar76,auVar130);
                              auVar77 = ZEXT1632(auVar109);
                              local_5f00.valid = (int *)auVar77._0_8_;
                              local_5f00.geometryUserPtr = (void *)auVar77._8_8_;
                              local_5f00.context = (RTCRayQueryContext *)auVar77._16_8_;
                              local_5f00.ray = (RTCRayN *)auVar77._24_8_;
                              auVar6._8_8_ = 0;
                              auVar6._0_8_ = *(ulong *)(lVar60 + 0x58);
                              auVar77 = vpmovzxbd_avx2(auVar6);
                              auVar77 = vcvtdq2ps_avx(auVar77);
                              auVar109 = vfmadd213ps_fma(auVar77,auVar76,auVar130);
                              local_5e80 = ZEXT1632(auVar109);
                              auVar7._8_8_ = 0;
                              auVar7._0_8_ = *(ulong *)(lVar60 + 0x60);
                              auVar77 = vpmovzxbd_avx2(auVar7);
                              uVar70 = *(undefined4 *)(lVar60 + 0x84);
                              auVar123._4_4_ = uVar70;
                              auVar123._0_4_ = uVar70;
                              auVar123._8_4_ = uVar70;
                              auVar123._12_4_ = uVar70;
                              auVar123._16_4_ = uVar70;
                              auVar123._20_4_ = uVar70;
                              auVar123._24_4_ = uVar70;
                              auVar123._28_4_ = uVar70;
                              uVar70 = *(undefined4 *)(lVar60 + 0x78);
                              auVar131._4_4_ = uVar70;
                              auVar131._0_4_ = uVar70;
                              auVar131._8_4_ = uVar70;
                              auVar131._12_4_ = uVar70;
                              auVar131._16_4_ = uVar70;
                              auVar131._20_4_ = uVar70;
                              auVar131._24_4_ = uVar70;
                              auVar131._28_4_ = uVar70;
                              auVar77 = vcvtdq2ps_avx(auVar77);
                              auVar109 = vfmadd213ps_fma(auVar77,auVar123,auVar131);
                              local_5d20 = ZEXT1632(auVar109);
                              auVar8._8_8_ = 0;
                              auVar8._0_8_ = *(ulong *)(lVar60 + 0x68);
                              auVar77 = vpmovzxbd_avx2(auVar8);
                              lVar58 = 0;
                              for (uVar56 = uVar63; (uVar56 & 1) == 0;
                                  uVar56 = uVar56 >> 1 | 0x8000000000000000) {
                                lVar58 = lVar58 + 1;
                              }
                              auVar77 = vcvtdq2ps_avx(auVar77);
                              auVar109 = vfmadd213ps_fma(auVar77,auVar123,auVar131);
                              local_5d40 = ZEXT1632(auVar109);
                              uVar56 = (ulong)(uint)((int)lVar58 * 4);
                              uVar70 = *(undefined4 *)(local_5ae0 + uVar56);
                              auVar77._4_4_ = uVar70;
                              auVar77._0_4_ = uVar70;
                              auVar77._8_4_ = uVar70;
                              auVar77._12_4_ = uVar70;
                              auVar77._16_4_ = uVar70;
                              auVar77._20_4_ = uVar70;
                              auVar77._24_4_ = uVar70;
                              auVar77._28_4_ = uVar70;
                              auVar84._8_8_ = local_5ca0._8_8_;
                              auVar84._0_8_ = local_5ca0._0_8_;
                              auVar84._16_8_ = local_5ca0._16_8_;
                              auVar84._24_8_ = local_5ca0._24_8_;
                              auVar79._8_8_ = local_5ca0._40_8_;
                              auVar79._0_8_ = local_5ca0._32_8_;
                              auVar79._16_8_ = local_5ca0._48_8_;
                              auVar79._24_8_ = local_5ca0._56_8_;
                              auVar80._8_8_ = local_5ca0._72_8_;
                              auVar80._0_8_ = local_5ca0._64_8_;
                              auVar80._16_8_ = local_5ca0._80_8_;
                              auVar80._24_8_ = local_5ca0._88_8_;
                              auVar77 = vsubps_avx(auVar77,auVar84);
                              auVar88._4_4_ = (float)local_5be0._4_4_ * auVar77._4_4_;
                              auVar88._0_4_ = (float)local_5be0._0_4_ * auVar77._0_4_;
                              auVar88._8_4_ = fStack_5bd8 * auVar77._8_4_;
                              auVar88._12_4_ = fStack_5bd4 * auVar77._12_4_;
                              auVar88._16_4_ = fStack_5bd0 * auVar77._16_4_;
                              auVar88._20_4_ = fStack_5bcc * auVar77._20_4_;
                              auVar88._24_4_ = fStack_5bc8 * auVar77._24_4_;
                              auVar88._28_4_ = auVar77._28_4_;
                              uVar70 = *(undefined4 *)((long)&local_5f00.valid + uVar56);
                              auVar85._4_4_ = uVar70;
                              auVar85._0_4_ = uVar70;
                              auVar85._8_4_ = uVar70;
                              auVar85._12_4_ = uVar70;
                              auVar85._16_4_ = uVar70;
                              auVar85._20_4_ = uVar70;
                              auVar85._24_4_ = uVar70;
                              auVar85._28_4_ = uVar70;
                              auVar77 = vsubps_avx(auVar85,auVar79);
                              auVar89._4_4_ = (float)local_5bc0._4_4_ * auVar77._4_4_;
                              auVar89._0_4_ = (float)local_5bc0._0_4_ * auVar77._0_4_;
                              auVar89._8_4_ = fStack_5bb8 * auVar77._8_4_;
                              auVar89._12_4_ = fStack_5bb4 * auVar77._12_4_;
                              auVar89._16_4_ = fStack_5bb0 * auVar77._16_4_;
                              auVar89._20_4_ = fStack_5bac * auVar77._20_4_;
                              auVar89._24_4_ = fStack_5ba8 * auVar77._24_4_;
                              auVar89._28_4_ = auVar77._28_4_;
                              auVar137 = ZEXT3264(auVar89);
                              uVar70 = *(undefined4 *)(local_5d20 + uVar56);
                              auVar86._4_4_ = uVar70;
                              auVar86._0_4_ = uVar70;
                              auVar86._8_4_ = uVar70;
                              auVar86._12_4_ = uVar70;
                              auVar86._16_4_ = uVar70;
                              auVar86._20_4_ = uVar70;
                              auVar86._24_4_ = uVar70;
                              auVar86._28_4_ = uVar70;
                              auVar77 = vsubps_avx(auVar86,auVar80);
                              auVar90._4_4_ = (float)local_5ba0._4_4_ * auVar77._4_4_;
                              auVar90._0_4_ = (float)local_5ba0._0_4_ * auVar77._0_4_;
                              auVar90._8_4_ = fStack_5b98 * auVar77._8_4_;
                              auVar90._12_4_ = fStack_5b94 * auVar77._12_4_;
                              auVar90._16_4_ = fStack_5b90 * auVar77._16_4_;
                              auVar90._20_4_ = fStack_5b8c * auVar77._20_4_;
                              auVar90._24_4_ = fStack_5b88 * auVar77._24_4_;
                              auVar90._28_4_ = auVar77._28_4_;
                              auVar139 = ZEXT3264(auVar90);
                              uVar70 = *(undefined4 *)(local_59c0 + uVar56);
                              auVar87._4_4_ = uVar70;
                              auVar87._0_4_ = uVar70;
                              auVar87._8_4_ = uVar70;
                              auVar87._12_4_ = uVar70;
                              auVar87._16_4_ = uVar70;
                              auVar87._20_4_ = uVar70;
                              auVar87._24_4_ = uVar70;
                              auVar87._28_4_ = uVar70;
                              in_ZMM9 = ZEXT3264(auVar87);
                              auVar77 = vsubps_avx(auVar87,auVar84);
                              auVar102._4_4_ = (float)local_5be0._4_4_ * auVar77._4_4_;
                              auVar102._0_4_ = (float)local_5be0._0_4_ * auVar77._0_4_;
                              auVar102._8_4_ = fStack_5bd8 * auVar77._8_4_;
                              auVar102._12_4_ = fStack_5bd4 * auVar77._12_4_;
                              auVar102._16_4_ = fStack_5bd0 * auVar77._16_4_;
                              auVar102._20_4_ = fStack_5bcc * auVar77._20_4_;
                              auVar102._24_4_ = fStack_5bc8 * auVar77._24_4_;
                              auVar102._28_4_ = auVar77._28_4_;
                              uVar70 = *(undefined4 *)(local_5e80 + uVar56);
                              auVar81._4_4_ = uVar70;
                              auVar81._0_4_ = uVar70;
                              auVar81._8_4_ = uVar70;
                              auVar81._12_4_ = uVar70;
                              auVar81._16_4_ = uVar70;
                              auVar81._20_4_ = uVar70;
                              auVar81._24_4_ = uVar70;
                              auVar81._28_4_ = uVar70;
                              auVar77 = vsubps_avx(auVar81,auVar79);
                              auVar23._4_4_ = (float)local_5bc0._4_4_ * auVar77._4_4_;
                              auVar23._0_4_ = (float)local_5bc0._0_4_ * auVar77._0_4_;
                              auVar23._8_4_ = fStack_5bb8 * auVar77._8_4_;
                              auVar23._12_4_ = fStack_5bb4 * auVar77._12_4_;
                              auVar23._16_4_ = fStack_5bb0 * auVar77._16_4_;
                              auVar23._20_4_ = fStack_5bac * auVar77._20_4_;
                              auVar23._24_4_ = fStack_5ba8 * auVar77._24_4_;
                              auVar23._28_4_ = auVar77._28_4_;
                              uVar70 = *(undefined4 *)(local_5d40 + uVar56);
                              auVar82._4_4_ = uVar70;
                              auVar82._0_4_ = uVar70;
                              auVar82._8_4_ = uVar70;
                              auVar82._12_4_ = uVar70;
                              auVar82._16_4_ = uVar70;
                              auVar82._20_4_ = uVar70;
                              auVar82._24_4_ = uVar70;
                              auVar82._28_4_ = uVar70;
                              auVar77 = vsubps_avx(auVar82,auVar80);
                              auVar83._4_4_ = (float)local_5ba0._4_4_ * auVar77._4_4_;
                              auVar83._0_4_ = (float)local_5ba0._0_4_ * auVar77._0_4_;
                              auVar83._8_4_ = fStack_5b98 * auVar77._8_4_;
                              auVar83._12_4_ = fStack_5b94 * auVar77._12_4_;
                              auVar83._16_4_ = fStack_5b90 * auVar77._16_4_;
                              auVar83._20_4_ = fStack_5b8c * auVar77._20_4_;
                              auVar83._24_4_ = fStack_5b88 * auVar77._24_4_;
                              auVar83._28_4_ = auVar77._28_4_;
                              auVar77 = vminps_avx(auVar88,auVar102);
                              auVar78 = vminps_avx(auVar89,auVar23);
                              auVar77 = vmaxps_avx(auVar77,auVar78);
                              auVar78 = vminps_avx(auVar90,auVar83);
                              auVar77 = vmaxps_avx(auVar77,auVar78);
                              auVar76 = vmulps_avx512vl(auVar77,auVar149._0_32_);
                              auVar77 = vmaxps_avx(auVar88,auVar102);
                              auVar78 = vmaxps_avx(auVar89,auVar23);
                              auVar78 = vminps_avx(auVar77,auVar78);
                              auVar77 = vmaxps_avx(auVar90,auVar83);
                              auVar77 = vminps_avx(auVar78,auVar77);
                              auVar78 = vmulps_avx512vl(auVar77,auVar150._0_32_);
                              auVar77 = vmaxps_avx(auVar76,local_5b20);
                              auVar78 = vminps_avx(auVar78,local_5b00);
                              uVar25 = vcmpps_avx512vl(auVar77,auVar78,2);
                              if ((bVar59 & (byte)uVar25) == 0) {
                                bVar73 = false;
                              }
                              else {
                                local_5da8 = uVar63;
                                uVar9 = *(ushort *)(lVar60 + lVar58 * 8);
                                uVar10 = *(ushort *)(lVar60 + 2 + lVar58 * 8);
                                pGVar11 = (context->scene->geometries).items
                                          [*(uint *)(lVar60 + 0x88)].ptr;
                                lVar64 = *(long *)&pGVar11->field_0x58;
                                lVar12 = *(long *)&pGVar11[1].time_range.upper;
                                lVar58 = (ulong)*(uint *)(lVar60 + 4 + lVar58 * 8) *
                                         pGVar11[1].super_RefCount.refCounter.
                                         super___atomic_base<unsigned_long>._M_i;
                                uVar54 = uVar9 & 0x7fff;
                                local_5f7c = uVar10 & 0x7fff;
                                uVar72 = *(uint *)(lVar64 + 4 + lVar58);
                                uVar63 = (ulong)uVar72;
                                uVar56 = (ulong)(uVar72 * local_5f7c +
                                                *(int *)(lVar64 + lVar58) + uVar54);
                                p_Var13 = pGVar11[1].intersectionFilterN;
                                puVar1 = (undefined8 *)(lVar12 + (uVar56 + 1) * (long)p_Var13);
                                local_59c0._16_8_ = *puVar1;
                                local_59c0._24_8_ = puVar1[1];
                                lVar60 = uVar56 + uVar63;
                                puVar1 = (undefined8 *)(lVar12 + lVar60 * (long)p_Var13);
                                local_5990 = *puVar1;
                                uStack_5988 = puVar1[1];
                                lVar67 = uVar56 + uVar63 + 1;
                                puVar1 = (undefined8 *)(lVar12 + lVar67 * (long)p_Var13);
                                local_59a0 = *puVar1;
                                uStack_5998 = puVar1[1];
                                uVar74 = (ulong)(-1 < (short)uVar9);
                                puVar1 = (undefined8 *)
                                         (lVar12 + (uVar56 + uVar74 + 1) * (long)p_Var13);
                                lVar61 = uVar74 + lVar67;
                                puVar2 = (undefined8 *)(lVar12 + lVar61 * (long)p_Var13);
                                local_5960 = *puVar2;
                                uStack_5958 = puVar2[1];
                                if ((short)uVar10 < 0) {
                                  uVar63 = 0;
                                }
                                puVar2 = (undefined8 *)(lVar12 + (lVar60 + uVar63) * (long)p_Var13);
                                puVar3 = (undefined8 *)(lVar12 + (lVar67 + uVar63) * (long)p_Var13);
                                local_5920 = *puVar3;
                                uStack_5918 = puVar3[1];
                                puVar3 = (undefined8 *)(lVar12 + (uVar63 + lVar61) * (long)p_Var13);
                                local_5cf0 = vpbroadcastd_avx512vl();
                                local_59c0._0_16_ =
                                     *(undefined1 (*) [16])(lVar12 + (long)p_Var13 * uVar56);
                                local_5980 = local_59c0._16_8_;
                                uStack_5978 = local_59c0._24_8_;
                                local_5970 = *puVar1;
                                uStack_5968 = puVar1[1];
                                local_5950 = local_59a0;
                                uStack_5948 = uStack_5998;
                                local_5940 = local_5990;
                                uStack_5938 = uStack_5988;
                                local_5930 = local_59a0;
                                uStack_5928 = uStack_5998;
                                local_5910 = *puVar2;
                                uStack_5908 = puVar2[1];
                                local_5900 = local_59a0;
                                uStack_58f8 = uStack_5998;
                                local_58f0 = local_5960;
                                uStack_58e8 = uStack_5958;
                                local_58e0 = *puVar3;
                                uStack_58d8 = puVar3[1];
                                local_58d0 = local_5920;
                                uStack_58c8 = uStack_5918;
                                local_5d00 = vpbroadcastd_avx512vl();
                                puVar62 = (uint *)&uStack_5988;
                                pRVar65 = local_5f98;
                                context = local_5f90;
                                uVar74 = 0;
                                bVar52 = bVar59;
                                do {
                                  uVar72 = puVar62[-0xe];
                                  auVar99._4_4_ = uVar72;
                                  auVar99._0_4_ = uVar72;
                                  auVar99._8_4_ = uVar72;
                                  auVar99._12_4_ = uVar72;
                                  auVar99._16_4_ = uVar72;
                                  auVar99._20_4_ = uVar72;
                                  auVar99._24_4_ = uVar72;
                                  auVar99._28_4_ = uVar72;
                                  uVar72 = puVar62[-0xd];
                                  auVar100._4_4_ = uVar72;
                                  auVar100._0_4_ = uVar72;
                                  auVar100._8_4_ = uVar72;
                                  auVar100._12_4_ = uVar72;
                                  auVar100._16_4_ = uVar72;
                                  auVar100._20_4_ = uVar72;
                                  auVar100._24_4_ = uVar72;
                                  auVar100._28_4_ = uVar72;
                                  uVar72 = puVar62[-0xc];
                                  auVar101._4_4_ = uVar72;
                                  auVar101._0_4_ = uVar72;
                                  auVar101._8_4_ = uVar72;
                                  auVar101._12_4_ = uVar72;
                                  auVar101._16_4_ = uVar72;
                                  auVar101._20_4_ = uVar72;
                                  auVar101._24_4_ = uVar72;
                                  auVar101._28_4_ = uVar72;
                                  uVar72 = puVar62[-10];
                                  local_5e00._4_4_ = uVar72;
                                  local_5e00._0_4_ = uVar72;
                                  local_5e00._8_4_ = uVar72;
                                  local_5e00._12_4_ = uVar72;
                                  local_5e00._16_4_ = uVar72;
                                  local_5e00._20_4_ = uVar72;
                                  local_5e00._24_4_ = uVar72;
                                  local_5e00._28_4_ = uVar72;
                                  uVar72 = puVar62[-9];
                                  local_5e20._4_4_ = uVar72;
                                  local_5e20._0_4_ = uVar72;
                                  local_5e20._8_4_ = uVar72;
                                  local_5e20._12_4_ = uVar72;
                                  local_5e20._16_4_ = uVar72;
                                  local_5e20._20_4_ = uVar72;
                                  local_5e20._24_4_ = uVar72;
                                  local_5e20._28_4_ = uVar72;
                                  uVar72 = puVar62[-8];
                                  local_5e40._4_4_ = uVar72;
                                  local_5e40._0_4_ = uVar72;
                                  local_5e40._8_4_ = uVar72;
                                  local_5e40._12_4_ = uVar72;
                                  local_5e40._16_4_ = uVar72;
                                  local_5e40._20_4_ = uVar72;
                                  local_5e40._24_4_ = uVar72;
                                  local_5e40._28_4_ = uVar72;
                                  uVar72 = puVar62[-2];
                                  local_5e60._4_4_ = uVar72;
                                  local_5e60._0_4_ = uVar72;
                                  local_5e60._8_4_ = uVar72;
                                  local_5e60._12_4_ = uVar72;
                                  local_5e60._16_4_ = uVar72;
                                  local_5e60._20_4_ = uVar72;
                                  local_5e60._24_4_ = uVar72;
                                  local_5e60._28_4_ = uVar72;
                                  local_5840 = vbroadcastss_avx512vl(ZEXT416(puVar62[-1]));
                                  local_5860 = vbroadcastss_avx512vl(ZEXT416(*puVar62));
                                  local_5d20._0_16_ = local_5d00;
                                  local_5d40._0_16_ = local_5cf0;
                                  auVar77 = *(undefined1 (*) [32])pRVar65;
                                  auVar78 = *(undefined1 (*) [32])(pRVar65 + 0x20);
                                  auVar76 = *(undefined1 (*) [32])(pRVar65 + 0x40);
                                  auVar94 = *(undefined1 (*) [32])(pRVar65 + 0x80);
                                  auVar95 = *(undefined1 (*) [32])(pRVar65 + 0xa0);
                                  auVar123 = *(undefined1 (*) [32])(pRVar65 + 0xc0);
                                  auVar137 = ZEXT3264(auVar123);
                                  auVar129 = vsubps_avx(auVar99,auVar77);
                                  auVar130 = vsubps_avx(auVar100,auVar78);
                                  auVar131 = vsubps_avx(auVar101,auVar76);
                                  auVar88 = vsubps_avx(local_5e00,auVar77);
                                  auVar89 = vsubps_avx(local_5e20,auVar78);
                                  auVar90 = vsubps_avx(local_5e40,auVar76);
                                  auVar77 = vsubps_avx(local_5e60,auVar77);
                                  auVar79 = vsubps_avx512vl(local_5840,auVar78);
                                  auVar80 = vsubps_avx512vl(local_5860,auVar76);
                                  auVar78 = vsubps_avx(auVar77,auVar129);
                                  auVar81 = vsubps_avx512vl(auVar79,auVar130);
                                  auVar82 = vsubps_avx512vl(auVar80,auVar131);
                                  auVar139 = ZEXT3264(auVar82);
                                  auVar76 = vsubps_avx(auVar129,auVar88);
                                  in_ZMM9 = ZEXT3264(auVar76);
                                  auVar102 = vsubps_avx(auVar130,auVar89);
                                  auVar23 = vsubps_avx(auVar131,auVar90);
                                  auVar83 = vaddps_avx512vl(auVar77,auVar129);
                                  auVar84 = vaddps_avx512vl(auVar79,auVar130);
                                  auVar85 = vaddps_avx512vl(auVar80,auVar131);
                                  auVar86 = vmulps_avx512vl(auVar84,auVar82);
                                  auVar86 = vfmsub231ps_avx512vl(auVar86,auVar81,auVar85);
                                  auVar85 = vmulps_avx512vl(auVar85,auVar78);
                                  auVar85 = vfmsub231ps_avx512vl(auVar85,auVar82,auVar83);
                                  auVar83 = vmulps_avx512vl(auVar83,auVar81);
                                  auVar83 = vfmsub231ps_avx512vl(auVar83,auVar78,auVar84);
                                  auVar83 = vmulps_avx512vl(auVar83,auVar123);
                                  auVar83 = vfmadd231ps_avx512vl(auVar83,auVar95,auVar85);
                                  auVar83 = vfmadd231ps_avx512vl(auVar83,auVar94,auVar86);
                                  auVar84 = vaddps_avx512vl(auVar129,auVar88);
                                  auVar85 = vaddps_avx512vl(auVar130,auVar89);
                                  auVar86 = vaddps_avx512vl(auVar131,auVar90);
                                  auVar87 = vmulps_avx512vl(auVar85,auVar23);
                                  auVar87 = vfmsub231ps_avx512vl(auVar87,auVar102,auVar86);
                                  auVar86 = vmulps_avx512vl(auVar86,auVar76);
                                  auVar86 = vfmsub231ps_avx512vl(auVar86,auVar23,auVar84);
                                  auVar84 = vmulps_avx512vl(auVar84,auVar102);
                                  auVar84 = vfmsub231ps_avx512vl(auVar84,auVar76,auVar85);
                                  auVar84 = vmulps_avx512vl(auVar84,auVar123);
                                  auVar84 = vfmadd231ps_avx512vl(auVar84,auVar95,auVar86);
                                  auVar85 = vsubps_avx512vl(auVar88,auVar77);
                                  auVar84 = vfmadd231ps_avx512vl(auVar84,auVar94,auVar87);
                                  auVar86 = vsubps_avx512vl(auVar89,auVar79);
                                  auVar143._0_4_ = auVar88._0_4_ + auVar77._0_4_;
                                  auVar143._4_4_ = auVar88._4_4_ + auVar77._4_4_;
                                  auVar143._8_4_ = auVar88._8_4_ + auVar77._8_4_;
                                  auVar143._12_4_ = auVar88._12_4_ + auVar77._12_4_;
                                  auVar143._16_4_ = auVar88._16_4_ + auVar77._16_4_;
                                  auVar143._20_4_ = auVar88._20_4_ + auVar77._20_4_;
                                  auVar143._24_4_ = auVar88._24_4_ + auVar77._24_4_;
                                  auVar143._28_4_ = auVar88._28_4_ + auVar77._28_4_;
                                  auVar88 = vsubps_avx512vl(auVar90,auVar80);
                                  auVar77 = vaddps_avx512vl(auVar89,auVar79);
                                  auVar89 = vaddps_avx512vl(auVar90,auVar80);
                                  auVar90 = vmulps_avx512vl(auVar77,auVar88);
                                  auVar90 = vfmsub231ps_avx512vl(auVar90,auVar86,auVar89);
                                  auVar89 = vmulps_avx512vl(auVar89,auVar85);
                                  auVar89 = vfmsub231ps_avx512vl(auVar89,auVar88,auVar143);
                                  auVar79 = vmulps_avx512vl(auVar143,auVar86);
                                  auVar77 = vfmsub231ps_avx512vl(auVar79,auVar85,auVar77);
                                  auVar98._4_4_ = auVar77._4_4_ * auVar123._4_4_;
                                  auVar98._0_4_ = auVar77._0_4_ * auVar123._0_4_;
                                  auVar98._8_4_ = auVar77._8_4_ * auVar123._8_4_;
                                  auVar98._12_4_ = auVar77._12_4_ * auVar123._12_4_;
                                  auVar98._16_4_ = auVar77._16_4_ * auVar123._16_4_;
                                  auVar98._20_4_ = auVar77._20_4_ * auVar123._20_4_;
                                  auVar98._24_4_ = auVar77._24_4_ * auVar123._24_4_;
                                  auVar98._28_4_ = auVar77._28_4_;
                                  auVar109 = vfmadd231ps_fma(auVar98,auVar95,auVar89);
                                  auVar109 = vfmadd231ps_fma(ZEXT1632(auVar109),auVar94,auVar90);
                                  auVar77 = vaddps_avx512vl(auVar83,auVar84);
                                  local_5f60._0_4_ = auVar109._0_4_ + auVar77._0_4_;
                                  local_5f60._4_4_ = auVar109._4_4_ + auVar77._4_4_;
                                  fStack_5f58 = auVar109._8_4_ + auVar77._8_4_;
                                  fStack_5f54 = auVar109._12_4_ + auVar77._12_4_;
                                  fStack_5f50 = auVar77._16_4_ + 0.0;
                                  fStack_5f4c = auVar77._20_4_ + 0.0;
                                  fStack_5f48 = auVar77._24_4_ + 0.0;
                                  register0x0000155c = auVar77._28_4_ + 0.0;
                                  auVar79 = auVar147._0_32_;
                                  vandps_avx512vl(_local_5f60,auVar79);
                                  auVar97._8_4_ = 0x34000000;
                                  auVar97._0_8_ = 0x3400000034000000;
                                  auVar97._12_4_ = 0x34000000;
                                  auVar97._16_4_ = 0x34000000;
                                  auVar97._20_4_ = 0x34000000;
                                  auVar97._24_4_ = 0x34000000;
                                  auVar97._28_4_ = 0x34000000;
                                  auVar89 = vmulps_avx512vl(auVar77,auVar97);
                                  auVar77 = vminps_avx512vl(auVar83,auVar84);
                                  auVar77 = vminps_avx(auVar77,ZEXT1632(auVar109));
                                  auVar90 = vxorps_avx512vl(auVar89,auVar151._0_32_);
                                  uVar25 = vcmpps_avx512vl(auVar77,auVar90,5);
                                  auVar77 = vmaxps_avx512vl(auVar83,auVar84);
                                  auVar77 = vmaxps_avx(auVar77,ZEXT1632(auVar109));
                                  local_5880 = puVar62[-6];
                                  uStack_587c = local_5880;
                                  uStack_5878 = local_5880;
                                  uStack_5874 = local_5880;
                                  uStack_5870 = local_5880;
                                  uStack_586c = local_5880;
                                  uStack_5868 = local_5880;
                                  uStack_5864 = local_5880;
                                  uVar26 = vcmpps_avx512vl(auVar77,auVar89,2);
                                  local_58a0 = puVar62[-5];
                                  uStack_589c = local_58a0;
                                  uStack_5898 = local_58a0;
                                  uStack_5894 = local_58a0;
                                  uStack_5890 = local_58a0;
                                  uStack_588c = local_58a0;
                                  uStack_5888 = local_58a0;
                                  uStack_5884 = local_58a0;
                                  local_58c0 = puVar62[-4];
                                  uStack_58bc = local_58c0;
                                  uStack_58b8 = local_58c0;
                                  uStack_58b4 = local_58c0;
                                  uStack_58b0 = local_58c0;
                                  uStack_58ac = local_58c0;
                                  uStack_58a8 = local_58c0;
                                  uStack_58a4 = local_58c0;
                                  bVar71 = ((byte)uVar25 | (byte)uVar26) & bVar52;
                                  uVar72 = (uint)bVar71;
                                  if (bVar71 == 0) {
LAB_0088dc74:
                                    auVar93 = local_5ea0;
                                    auVar38 = in_ZMM10._0_32_;
                                    auVar83 = in_ZMM30._0_32_;
                                    auVar92 = local_5ec0;
                                    auVar84 = in_ZMM29._0_32_;
                                    auVar91 = local_5f20;
                                    _local_5f60 = in_ZMM27._0_32_;
                                  }
                                  else {
                                    auVar35._4_4_ = auVar102._4_4_ * auVar82._4_4_;
                                    auVar35._0_4_ = auVar102._0_4_ * auVar82._0_4_;
                                    auVar35._8_4_ = auVar102._8_4_ * auVar82._8_4_;
                                    auVar35._12_4_ = auVar102._12_4_ * auVar82._12_4_;
                                    auVar35._16_4_ = auVar102._16_4_ * auVar82._16_4_;
                                    auVar35._20_4_ = auVar102._20_4_ * auVar82._20_4_;
                                    auVar35._24_4_ = auVar102._24_4_ * auVar82._24_4_;
                                    auVar35._28_4_ = local_58c0;
                                    auVar36._4_4_ = auVar23._4_4_ * auVar78._4_4_;
                                    auVar36._0_4_ = auVar23._0_4_ * auVar78._0_4_;
                                    auVar36._8_4_ = auVar23._8_4_ * auVar78._8_4_;
                                    auVar36._12_4_ = auVar23._12_4_ * auVar78._12_4_;
                                    auVar36._16_4_ = auVar23._16_4_ * auVar78._16_4_;
                                    auVar36._20_4_ = auVar23._20_4_ * auVar78._20_4_;
                                    auVar36._24_4_ = auVar23._24_4_ * auVar78._24_4_;
                                    auVar36._28_4_ = auVar89._28_4_;
                                    auVar37._4_4_ = auVar76._4_4_ * auVar81._4_4_;
                                    auVar37._0_4_ = auVar76._0_4_ * auVar81._0_4_;
                                    auVar37._8_4_ = auVar76._8_4_ * auVar81._8_4_;
                                    auVar37._12_4_ = auVar76._12_4_ * auVar81._12_4_;
                                    auVar37._16_4_ = auVar76._16_4_ * auVar81._16_4_;
                                    auVar37._20_4_ = auVar76._20_4_ * auVar81._20_4_;
                                    auVar37._24_4_ = auVar76._24_4_ * auVar81._24_4_;
                                    auVar37._28_4_ = local_5880;
                                    auVar77 = vmulps_avx512vl(auVar86,auVar23);
                                    auVar89 = vmulps_avx512vl(auVar76,auVar88);
                                    auVar90 = vmulps_avx512vl(auVar85,auVar102);
                                    auVar109 = vfmsub213ps_fma(auVar81,auVar23,auVar35);
                                    auVar75 = vfmsub213ps_fma(auVar82,auVar76,auVar36);
                                    auVar139 = ZEXT1664(auVar75);
                                    auVar146 = vfmsub213ps_fma(auVar78,auVar102,auVar37);
                                    auVar78 = vfmsub213ps_avx512vl(auVar88,auVar102,auVar77);
                                    auVar88 = vfmsub213ps_avx512vl(auVar85,auVar23,auVar89);
                                    auVar76 = vfmsub213ps_avx512vl(auVar86,auVar76,auVar90);
                                    vandps_avx512vl(auVar35,auVar79);
                                    vandps_avx512vl(auVar77,auVar79);
                                    uVar63 = vcmpps_avx512vl(auVar76,auVar76,1);
                                    vandps_avx512vl(auVar36,auVar79);
                                    vandps_avx512vl(auVar89,auVar79);
                                    uVar56 = vcmpps_avx512vl(auVar76,auVar76,1);
                                    vandps_avx512vl(auVar37,auVar79);
                                    in_ZMM9 = ZEXT3264(auVar76);
                                    vandps_avx512vl(auVar90,auVar79);
                                    uVar24 = vcmpps_avx512vl(auVar76,auVar76,1);
                                    bVar73 = (bool)((byte)uVar63 & 1);
                                    auVar91._0_4_ =
                                         (uint)bVar73 * auVar109._0_4_ |
                                         (uint)!bVar73 * auVar78._0_4_;
                                    bVar73 = (bool)((byte)(uVar63 >> 1) & 1);
                                    auVar91._4_4_ =
                                         (uint)bVar73 * auVar109._4_4_ |
                                         (uint)!bVar73 * auVar78._4_4_;
                                    bVar73 = (bool)((byte)(uVar63 >> 2) & 1);
                                    auVar91._8_4_ =
                                         (uint)bVar73 * auVar109._8_4_ |
                                         (uint)!bVar73 * auVar78._8_4_;
                                    bVar73 = (bool)((byte)(uVar63 >> 3) & 1);
                                    auVar91._12_4_ =
                                         (uint)bVar73 * auVar109._12_4_ |
                                         (uint)!bVar73 * auVar78._12_4_;
                                    auVar91._16_4_ =
                                         (uint)!(bool)((byte)(uVar63 >> 4) & 1) * auVar78._16_4_;
                                    auVar91._20_4_ =
                                         (uint)!(bool)((byte)(uVar63 >> 5) & 1) * auVar78._20_4_;
                                    auVar91._24_4_ =
                                         (uint)!(bool)((byte)(uVar63 >> 6) & 1) * auVar78._24_4_;
                                    auVar91._28_4_ = (uint)!SUB81(uVar63 >> 7,0) * auVar78._28_4_;
                                    bVar73 = (bool)((byte)uVar56 & 1);
                                    auVar92._0_4_ =
                                         (uint)bVar73 * auVar75._0_4_ |
                                         (uint)!bVar73 * auVar88._0_4_;
                                    bVar73 = (bool)((byte)(uVar56 >> 1) & 1);
                                    auVar92._4_4_ =
                                         (uint)bVar73 * auVar75._4_4_ |
                                         (uint)!bVar73 * auVar88._4_4_;
                                    bVar73 = (bool)((byte)(uVar56 >> 2) & 1);
                                    auVar92._8_4_ =
                                         (uint)bVar73 * auVar75._8_4_ |
                                         (uint)!bVar73 * auVar88._8_4_;
                                    bVar73 = (bool)((byte)(uVar56 >> 3) & 1);
                                    auVar92._12_4_ =
                                         (uint)bVar73 * auVar75._12_4_ |
                                         (uint)!bVar73 * auVar88._12_4_;
                                    auVar92._16_4_ =
                                         (uint)!(bool)((byte)(uVar56 >> 4) & 1) * auVar88._16_4_;
                                    auVar92._20_4_ =
                                         (uint)!(bool)((byte)(uVar56 >> 5) & 1) * auVar88._20_4_;
                                    auVar92._24_4_ =
                                         (uint)!(bool)((byte)(uVar56 >> 6) & 1) * auVar88._24_4_;
                                    auVar92._28_4_ = (uint)!SUB81(uVar56 >> 7,0) * auVar88._28_4_;
                                    bVar73 = (bool)((byte)uVar24 & 1);
                                    auVar93._0_4_ =
                                         (uint)bVar73 * auVar146._0_4_ |
                                         (uint)!bVar73 * auVar76._0_4_;
                                    bVar73 = (bool)((byte)(uVar24 >> 1) & 1);
                                    auVar93._4_4_ =
                                         (uint)bVar73 * auVar146._4_4_ |
                                         (uint)!bVar73 * auVar76._4_4_;
                                    bVar73 = (bool)((byte)(uVar24 >> 2) & 1);
                                    auVar93._8_4_ =
                                         (uint)bVar73 * auVar146._8_4_ |
                                         (uint)!bVar73 * auVar76._8_4_;
                                    bVar73 = (bool)((byte)(uVar24 >> 3) & 1);
                                    auVar93._12_4_ =
                                         (uint)bVar73 * auVar146._12_4_ |
                                         (uint)!bVar73 * auVar76._12_4_;
                                    auVar93._16_4_ =
                                         (uint)!(bool)((byte)(uVar24 >> 4) & 1) * auVar76._16_4_;
                                    auVar93._20_4_ =
                                         (uint)!(bool)((byte)(uVar24 >> 5) & 1) * auVar76._20_4_;
                                    auVar93._24_4_ =
                                         (uint)!(bool)((byte)(uVar24 >> 6) & 1) * auVar76._24_4_;
                                    auVar93._28_4_ = (uint)!SUB81(uVar24 >> 7,0) * auVar76._28_4_;
                                    auVar77 = vmulps_avx512vl(auVar123,auVar93);
                                    auVar137 = ZEXT3264(auVar77);
                                    auVar77 = vfmadd213ps_avx512vl(auVar95,auVar92,auVar77);
                                    auVar77 = vfmadd213ps_avx512vl(auVar94,auVar91,auVar77);
                                    auVar132._0_4_ = auVar77._0_4_ + auVar77._0_4_;
                                    auVar132._4_4_ = auVar77._4_4_ + auVar77._4_4_;
                                    auVar132._8_4_ = auVar77._8_4_ + auVar77._8_4_;
                                    auVar132._12_4_ = auVar77._12_4_ + auVar77._12_4_;
                                    auVar132._16_4_ = auVar77._16_4_ + auVar77._16_4_;
                                    auVar132._20_4_ = auVar77._20_4_ + auVar77._20_4_;
                                    auVar132._24_4_ = auVar77._24_4_ + auVar77._24_4_;
                                    auVar132._28_4_ = auVar77._28_4_ + auVar77._28_4_;
                                    auVar77 = vmulps_avx512vl(auVar131,auVar93);
                                    auVar77 = vfmadd213ps_avx512vl(auVar130,auVar92,auVar77);
                                    auVar77 = vfmadd213ps_avx512vl(auVar129,auVar91,auVar77);
                                    auVar78 = vrcp14ps_avx512vl(auVar132);
                                    auVar94 = vxorps_avx512vl(auVar132,auVar151._0_32_);
                                    auVar28._8_4_ = 0x3f800000;
                                    auVar28._0_8_ = &DAT_3f8000003f800000;
                                    auVar28._12_4_ = 0x3f800000;
                                    auVar28._16_4_ = 0x3f800000;
                                    auVar28._20_4_ = 0x3f800000;
                                    auVar28._24_4_ = 0x3f800000;
                                    auVar28._28_4_ = 0x3f800000;
                                    auVar95 = vfnmadd213ps_avx512vl(auVar78,auVar132,auVar28);
                                    auVar109 = vfmadd132ps_fma(auVar95,auVar78,auVar78);
                                    auVar38._4_4_ = (auVar77._4_4_ + auVar77._4_4_) * auVar109._4_4_
                                    ;
                                    auVar38._0_4_ = (auVar77._0_4_ + auVar77._0_4_) * auVar109._0_4_
                                    ;
                                    auVar38._8_4_ = (auVar77._8_4_ + auVar77._8_4_) * auVar109._8_4_
                                    ;
                                    auVar38._12_4_ =
                                         (auVar77._12_4_ + auVar77._12_4_) * auVar109._12_4_;
                                    auVar38._16_4_ = (auVar77._16_4_ + auVar77._16_4_) * 0.0;
                                    auVar38._20_4_ = (auVar77._20_4_ + auVar77._20_4_) * 0.0;
                                    auVar38._24_4_ = (auVar77._24_4_ + auVar77._24_4_) * 0.0;
                                    auVar38._28_4_ = auVar76._28_4_;
                                    uVar25 = vcmpps_avx512vl(auVar38,*(undefined1 (*) [32])
                                                                      (pRVar65 + 0x100),2);
                                    uVar26 = vcmpps_avx512vl(auVar38,*(undefined1 (*) [32])
                                                                      (pRVar65 + 0x60),0xd);
                                    uVar27 = vcmpps_avx512vl(auVar132,auVar94,4);
                                    bVar71 = bVar71 & (byte)uVar25 & (byte)uVar26 & (byte)uVar27;
                                    uVar72 = (uint)bVar71;
                                    if (bVar71 == 0) goto LAB_0088dc74;
                                  }
                                  in_ZMM10 = ZEXT3264(auVar38);
                                  bVar57 = (byte)uVar72;
                                  bVar71 = bVar52;
                                  if (bVar57 != 0) {
                                    auVar146 = auVar147._0_16_;
                                    auVar109 = vcvtsi2ss_avx512f(auVar146,*(ushort *)
                                                                           (lVar64 + 8 + lVar58) - 1
                                                                );
                                    auVar121._4_12_ = ZEXT812(0) << 0x20;
                                    auVar121._0_4_ = auVar109._0_4_;
                                    auVar75 = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar121);
                                    auVar109 = vfnmadd213ss_fma(auVar109,auVar75,
                                                                SUB6416(ZEXT464(0x40000000),0));
                                    fVar108 = auVar75._0_4_ * auVar109._0_4_;
                                    auVar109 = vcvtsi2ss_avx512f(auVar146,*(ushort *)
                                                                           (lVar64 + 10 + lVar58) -
                                                                          1);
                                    auVar127._4_12_ = ZEXT812(0) << 0x20;
                                    auVar127._0_4_ = auVar109._0_4_;
                                    auVar75 = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar127);
                                    auVar109 = vfnmadd213ss_fma(auVar109,auVar75,
                                                                SUB6416(ZEXT464(0x40000000),0));
                                    fVar22 = auVar75._0_4_ * auVar109._0_4_;
                                    auVar109 = vcvtsi2ss_avx512f(auVar146,((uint)uVar74 & 1) +
                                                                          uVar54);
                                    fVar126 = auVar109._0_4_;
                                    auVar39._4_4_ = fVar126 * (float)local_5f60._4_4_;
                                    auVar39._0_4_ = fVar126 * (float)local_5f60._0_4_;
                                    auVar39._8_4_ = fVar126 * fStack_5f58;
                                    auVar39._12_4_ = fVar126 * fStack_5f54;
                                    auVar39._16_4_ = fVar126 * fStack_5f50;
                                    auVar39._20_4_ = fVar126 * fStack_5f4c;
                                    auVar39._24_4_ = fVar126 * fStack_5f48;
                                    auVar39._28_4_ = fVar126;
                                    auVar77 = vaddps_avx512vl(auVar83,auVar39);
                                    auVar116._4_4_ = fVar108;
                                    auVar116._0_4_ = fVar108;
                                    auVar116._8_4_ = fVar108;
                                    auVar116._12_4_ = fVar108;
                                    auVar116._16_4_ = fVar108;
                                    auVar116._20_4_ = fVar108;
                                    auVar116._24_4_ = fVar108;
                                    auVar116._28_4_ = fVar108;
                                    auVar77 = vmulps_avx512vl(auVar77,auVar116);
                                    local_5f20._0_4_ =
                                         (uint)(bVar57 & 1) * auVar77._0_4_ |
                                         (uint)!(bool)(bVar57 & 1) * auVar83._0_4_;
                                    bVar73 = (bool)((byte)(uVar72 >> 1) & 1);
                                    local_5f20._4_4_ =
                                         (uint)bVar73 * auVar77._4_4_ |
                                         (uint)!bVar73 * auVar83._4_4_;
                                    bVar73 = (bool)((byte)(uVar72 >> 2) & 1);
                                    local_5f20._8_4_ =
                                         (uint)bVar73 * auVar77._8_4_ |
                                         (uint)!bVar73 * auVar83._8_4_;
                                    bVar73 = (bool)((byte)(uVar72 >> 3) & 1);
                                    local_5f20._12_4_ =
                                         (uint)bVar73 * auVar77._12_4_ |
                                         (uint)!bVar73 * auVar83._12_4_;
                                    bVar73 = (bool)((byte)(uVar72 >> 4) & 1);
                                    local_5f20._16_4_ =
                                         (uint)bVar73 * auVar77._16_4_ |
                                         (uint)!bVar73 * auVar83._16_4_;
                                    bVar73 = (bool)((byte)(uVar72 >> 5) & 1);
                                    local_5f20._20_4_ =
                                         (uint)bVar73 * auVar77._20_4_ |
                                         (uint)!bVar73 * auVar83._20_4_;
                                    bVar73 = (bool)((byte)(uVar72 >> 6) & 1);
                                    local_5f20._24_4_ =
                                         (uint)bVar73 * auVar77._24_4_ |
                                         (uint)!bVar73 * auVar83._24_4_;
                                    local_5f20._28_4_ =
                                         (uVar72 >> 7) * auVar77._28_4_ |
                                         (uint)!SUB41(uVar72 >> 7,0) * auVar83._28_4_;
                                    auVar109 = vcvtsi2ss_avx512f(auVar146,((uint)(uVar74 >> 1) &
                                                                          0x7fffffff) + local_5f7c);
                                    fVar108 = auVar109._0_4_;
                                    auVar40._4_4_ = fVar108 * (float)local_5f60._4_4_;
                                    auVar40._0_4_ = fVar108 * (float)local_5f60._0_4_;
                                    auVar40._8_4_ = fVar108 * fStack_5f58;
                                    auVar40._12_4_ = fVar108 * fStack_5f54;
                                    auVar40._16_4_ = fVar108 * fStack_5f50;
                                    auVar40._20_4_ = fVar108 * fStack_5f4c;
                                    auVar40._24_4_ = fVar108 * fStack_5f48;
                                    auVar40._28_4_ = fVar108;
                                    auVar77 = vaddps_avx512vl(auVar84,auVar40);
                                    auVar124._4_4_ = fVar22;
                                    auVar124._0_4_ = fVar22;
                                    auVar124._8_4_ = fVar22;
                                    auVar124._12_4_ = fVar22;
                                    auVar124._16_4_ = fVar22;
                                    auVar124._20_4_ = fVar22;
                                    auVar124._24_4_ = fVar22;
                                    auVar124._28_4_ = fVar22;
                                    auVar77 = vmulps_avx512vl(auVar77,auVar124);
                                    auVar96._0_4_ =
                                         (uint)(bVar57 & 1) * auVar77._0_4_ |
                                         (uint)!(bool)(bVar57 & 1) * auVar84._0_4_;
                                    bVar73 = (bool)((byte)(uVar72 >> 1) & 1);
                                    auVar96._4_4_ =
                                         (uint)bVar73 * auVar77._4_4_ |
                                         (uint)!bVar73 * auVar84._4_4_;
                                    bVar73 = (bool)((byte)(uVar72 >> 2) & 1);
                                    auVar96._8_4_ =
                                         (uint)bVar73 * auVar77._8_4_ |
                                         (uint)!bVar73 * auVar84._8_4_;
                                    bVar73 = (bool)((byte)(uVar72 >> 3) & 1);
                                    auVar96._12_4_ =
                                         (uint)bVar73 * auVar77._12_4_ |
                                         (uint)!bVar73 * auVar84._12_4_;
                                    bVar73 = (bool)((byte)(uVar72 >> 4) & 1);
                                    auVar96._16_4_ =
                                         (uint)bVar73 * auVar77._16_4_ |
                                         (uint)!bVar73 * auVar84._16_4_;
                                    bVar73 = (bool)((byte)(uVar72 >> 5) & 1);
                                    auVar96._20_4_ =
                                         (uint)bVar73 * auVar77._20_4_ |
                                         (uint)!bVar73 * auVar84._20_4_;
                                    bVar73 = (bool)((byte)(uVar72 >> 6) & 1);
                                    auVar96._24_4_ =
                                         (uint)bVar73 * auVar77._24_4_ |
                                         (uint)!bVar73 * auVar84._24_4_;
                                    auVar96._28_4_ =
                                         (uVar72 >> 7) * auVar77._28_4_ |
                                         (uint)!SUB41(uVar72 >> 7,0) * auVar84._28_4_;
                                    pGVar11 = (context->scene->geometries).items
                                              [*(uint *)(local_5d20 + uVar74 * 4)].ptr;
                                    uVar72 = pGVar11->mask;
                                    auVar117._4_4_ = uVar72;
                                    auVar117._0_4_ = uVar72;
                                    auVar117._8_4_ = uVar72;
                                    auVar117._12_4_ = uVar72;
                                    auVar117._16_4_ = uVar72;
                                    auVar117._20_4_ = uVar72;
                                    auVar117._24_4_ = uVar72;
                                    auVar117._28_4_ = uVar72;
                                    uVar25 = vptestmd_avx512vl(auVar117,*(undefined1 (*) [32])
                                                                         (pRVar65 + 0x120));
                                    bVar51 = (byte)uVar25 & bVar57;
                                    uVar63 = (ulong)bVar51;
                                    auVar84 = auVar96;
                                    auVar83 = local_5f20;
                                    if (bVar51 != 0) {
                                      local_5ec0[0] = bVar52;
                                      if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                                         (pGVar11->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                                        vandps_avx512vl(_local_5f60,auVar79);
                                        auVar31._8_4_ = 0x219392ef;
                                        auVar31._0_8_ = 0x219392ef219392ef;
                                        auVar31._12_4_ = 0x219392ef;
                                        auVar31._16_4_ = 0x219392ef;
                                        auVar31._20_4_ = 0x219392ef;
                                        auVar31._24_4_ = 0x219392ef;
                                        auVar31._28_4_ = 0x219392ef;
                                        uVar56 = vcmpps_avx512vl(auVar96,auVar31,5);
                                        auVar77 = vrcp14ps_avx512vl(_local_5f60);
                                        auVar135._8_4_ = 0x3f800000;
                                        auVar135._0_8_ = &DAT_3f8000003f800000;
                                        auVar135._12_4_ = 0x3f800000;
                                        auVar135._16_4_ = 0x3f800000;
                                        auVar135._20_4_ = 0x3f800000;
                                        auVar135._24_4_ = 0x3f800000;
                                        auVar135._28_4_ = 0x3f800000;
                                        auVar109 = vfnmadd213ps_fma(auVar77,_local_5f60,auVar135);
                                        auVar77 = vfmadd132ps_avx512vl
                                                            (ZEXT1632(auVar109),auVar77,auVar77);
                                        auVar104._4_4_ =
                                             (uint)((byte)(uVar56 >> 1) & 1) * auVar77._4_4_;
                                        auVar104._0_4_ = (uint)((byte)uVar56 & 1) * auVar77._0_4_;
                                        auVar104._8_4_ =
                                             (uint)((byte)(uVar56 >> 2) & 1) * auVar77._8_4_;
                                        auVar104._12_4_ =
                                             (uint)((byte)(uVar56 >> 3) & 1) * auVar77._12_4_;
                                        auVar104._16_4_ =
                                             (uint)((byte)(uVar56 >> 4) & 1) * auVar77._16_4_;
                                        auVar104._20_4_ =
                                             (uint)((byte)(uVar56 >> 5) & 1) * auVar77._20_4_;
                                        auVar104._24_4_ =
                                             (uint)((byte)(uVar56 >> 6) & 1) * auVar77._24_4_;
                                        auVar104._28_4_ = (uint)(byte)(uVar56 >> 7) * auVar77._28_4_
                                        ;
                                        auVar77 = vmulps_avx512vl(local_5f20,auVar104);
                                        local_5a80 = vminps_avx(auVar77,auVar135);
                                        auVar77 = vmulps_avx512vl(auVar96,auVar104);
                                        local_5a60 = vminps_avx(auVar77,auVar135);
                                        pRVar14 = context->user;
                                        local_5a20 = vpbroadcastd_avx512vl();
                                        local_5a40 = vpbroadcastd_avx512vl();
                                        local_5ae0[0] = (RTCHitN)auVar91[0];
                                        local_5ae0[1] = (RTCHitN)auVar91[1];
                                        local_5ae0[2] = (RTCHitN)auVar91[2];
                                        local_5ae0[3] = (RTCHitN)auVar91[3];
                                        local_5ae0[4] = (RTCHitN)auVar91[4];
                                        local_5ae0[5] = (RTCHitN)auVar91[5];
                                        local_5ae0[6] = (RTCHitN)auVar91[6];
                                        local_5ae0[7] = (RTCHitN)auVar91[7];
                                        local_5ae0[8] = (RTCHitN)auVar91[8];
                                        local_5ae0[9] = (RTCHitN)auVar91[9];
                                        local_5ae0[10] = (RTCHitN)auVar91[10];
                                        local_5ae0[0xb] = (RTCHitN)auVar91[0xb];
                                        local_5ae0[0xc] = (RTCHitN)auVar91[0xc];
                                        local_5ae0[0xd] = (RTCHitN)auVar91[0xd];
                                        local_5ae0[0xe] = (RTCHitN)auVar91[0xe];
                                        local_5ae0[0xf] = (RTCHitN)auVar91[0xf];
                                        local_5ae0[0x10] = (RTCHitN)auVar91[0x10];
                                        local_5ae0[0x11] = (RTCHitN)auVar91[0x11];
                                        local_5ae0[0x12] = (RTCHitN)auVar91[0x12];
                                        local_5ae0[0x13] = (RTCHitN)auVar91[0x13];
                                        local_5ae0[0x14] = (RTCHitN)auVar91[0x14];
                                        local_5ae0[0x15] = (RTCHitN)auVar91[0x15];
                                        local_5ae0[0x16] = (RTCHitN)auVar91[0x16];
                                        local_5ae0[0x17] = (RTCHitN)auVar91[0x17];
                                        local_5ae0[0x18] = (RTCHitN)auVar91[0x18];
                                        local_5ae0[0x19] = (RTCHitN)auVar91[0x19];
                                        local_5ae0[0x1a] = (RTCHitN)auVar91[0x1a];
                                        local_5ae0[0x1b] = (RTCHitN)auVar91[0x1b];
                                        local_5ae0[0x1c] = (RTCHitN)auVar91[0x1c];
                                        local_5ae0[0x1d] = (RTCHitN)auVar91[0x1d];
                                        local_5ae0[0x1e] = (RTCHitN)auVar91[0x1e];
                                        local_5ae0[0x1f] = (RTCHitN)auVar91[0x1f];
                                        local_5ac0 = auVar92;
                                        local_5aa0 = auVar93;
                                        auVar77 = vpcmpeqd_avx2(local_5a80,local_5a80);
                                        local_5ec8[1] = auVar77;
                                        *local_5ec8 = auVar77;
                                        local_5a00 = pRVar14->instID[0];
                                        uStack_59fc = local_5a00;
                                        uStack_59f8 = local_5a00;
                                        uStack_59f4 = local_5a00;
                                        uStack_59f0 = local_5a00;
                                        uStack_59ec = local_5a00;
                                        uStack_59e8 = local_5a00;
                                        uStack_59e4 = local_5a00;
                                        local_59e0 = pRVar14->instPrimID[0];
                                        uStack_59dc = local_59e0;
                                        uStack_59d8 = local_59e0;
                                        uStack_59d4 = local_59e0;
                                        uStack_59d0 = local_59e0;
                                        uStack_59cc = local_59e0;
                                        uStack_59c8 = local_59e0;
                                        uStack_59c4 = local_59e0;
                                        local_5ea0 = *(undefined1 (*) [32])(pRVar65 + 0x100);
                                        auVar77 = vblendmps_avx512vl(local_5ea0,auVar38);
                                        bVar73 = (bool)(bVar51 >> 1 & 1);
                                        bVar15 = (bool)(bVar51 >> 2 & 1);
                                        bVar16 = (bool)(bVar51 >> 3 & 1);
                                        bVar17 = (bool)(bVar51 >> 4 & 1);
                                        bVar18 = (bool)(bVar51 >> 5 & 1);
                                        bVar19 = (bool)(bVar51 >> 6 & 1);
                                        *(uint *)(pRVar65 + 0x100) =
                                             (uint)(bVar51 & 1) * auVar77._0_4_ |
                                             !(bool)(bVar51 & 1) * local_59e0;
                                        *(uint *)(pRVar65 + 0x104) =
                                             (uint)bVar73 * auVar77._4_4_ | !bVar73 * local_59e0;
                                        *(uint *)(pRVar65 + 0x108) =
                                             (uint)bVar15 * auVar77._8_4_ | !bVar15 * local_59e0;
                                        *(uint *)(pRVar65 + 0x10c) =
                                             (uint)bVar16 * auVar77._12_4_ | !bVar16 * local_59e0;
                                        *(uint *)(pRVar65 + 0x110) =
                                             (uint)bVar17 * auVar77._16_4_ | !bVar17 * local_59e0;
                                        *(uint *)(pRVar65 + 0x114) =
                                             (uint)bVar18 * auVar77._20_4_ | !bVar18 * local_59e0;
                                        *(uint *)(pRVar65 + 0x118) =
                                             (uint)bVar19 * auVar77._24_4_ | !bVar19 * local_59e0;
                                        *(uint *)(pRVar65 + 0x11c) =
                                             (uint)(bVar51 >> 7) * auVar77._28_4_ |
                                             !(bool)(bVar51 >> 7) * local_59e0;
                                        local_5e80 = vpmovm2d_avx512vl(uVar63);
                                        local_5f00.geometryUserPtr = pGVar11->userPtr;
                                        local_5f00.valid = (int *)local_5e80;
                                        local_5f00.context = context->user;
                                        local_5f00.ray = (RTCRayN *)pRVar65;
                                        local_5f00.hit = local_5ae0;
                                        local_5f00.N = 8;
                                        local_5d60 = auVar92;
                                        local_5d80 = auVar96;
                                        local_5cc0 = auVar93;
                                        local_5ce0 = auVar91;
                                        local_5da0 = auVar38;
                                        local_5f88 = lVar64;
                                        if (pGVar11->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                                          auVar137 = ZEXT1664(auVar137._0_16_);
                                          auVar139 = ZEXT1664(auVar139._0_16_);
                                          in_ZMM9 = ZEXT1664(in_ZMM9._0_16_);
                                          local_5f78 = lVar58;
                                          (*pGVar11->occlusionFilterN)(&local_5f00);
                                          in_ZMM10 = ZEXT3264(local_5da0);
                                          auVar77 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                                          auVar151 = ZEXT3264(auVar77);
                                          auVar77 = vbroadcastss_avx512vl(ZEXT416(0x3f800003));
                                          auVar150 = ZEXT3264(auVar77);
                                          auVar77 = vbroadcastss_avx512vl(ZEXT416(0x3f7ffffa));
                                          auVar149 = ZEXT3264(auVar77);
                                          auVar77 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                                          auVar148 = ZEXT3264(auVar77);
                                          auVar77 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                                          auVar147 = ZEXT3264(auVar77);
                                          pRVar65 = local_5f98;
                                          lVar58 = local_5f78;
                                          context = local_5f90;
                                        }
                                        uVar63 = vptestmd_avx512vl(local_5e80,local_5e80);
                                        bVar52 = local_5ec0[0];
                                        if ((char)uVar63 != '\0') {
                                          p_Var13 = context->args->filter;
                                          if ((p_Var13 != (RTCFilterFunctionN)0x0) &&
                                             (((context->args->flags &
                                               RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                              (((pGVar11->field_8).field_0x2 & 0x40) != 0)))) {
                                            auVar137 = ZEXT1664(auVar137._0_16_);
                                            auVar139 = ZEXT1664(auVar139._0_16_);
                                            in_ZMM9 = ZEXT1664(in_ZMM9._0_16_);
                                            (*p_Var13)(&local_5f00);
                                            in_ZMM10 = ZEXT3264(local_5da0);
                                            auVar77 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                                            auVar151 = ZEXT3264(auVar77);
                                            auVar77 = vbroadcastss_avx512vl(ZEXT416(0x3f800003));
                                            auVar150 = ZEXT3264(auVar77);
                                            auVar77 = vbroadcastss_avx512vl(ZEXT416(0x3f7ffffa));
                                            auVar149 = ZEXT3264(auVar77);
                                            auVar77 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                                            auVar148 = ZEXT3264(auVar77);
                                            auVar77 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                                            auVar147 = ZEXT3264(auVar77);
                                            pRVar65 = local_5f98;
                                            context = local_5f90;
                                          }
                                          uVar63 = vptestmd_avx512vl(local_5e80,local_5e80);
                                          auVar77 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                                          bVar73 = (bool)((byte)uVar63 & 1);
                                          auVar105._0_4_ =
                                               (uint)bVar73 * auVar77._0_4_ |
                                               (uint)!bVar73 * *(int *)(local_5f00.ray + 0x100);
                                          bVar73 = (bool)((byte)(uVar63 >> 1) & 1);
                                          auVar105._4_4_ =
                                               (uint)bVar73 * auVar77._4_4_ |
                                               (uint)!bVar73 * *(int *)(local_5f00.ray + 0x104);
                                          bVar73 = (bool)((byte)(uVar63 >> 2) & 1);
                                          auVar105._8_4_ =
                                               (uint)bVar73 * auVar77._8_4_ |
                                               (uint)!bVar73 * *(int *)(local_5f00.ray + 0x108);
                                          bVar73 = (bool)((byte)(uVar63 >> 3) & 1);
                                          auVar105._12_4_ =
                                               (uint)bVar73 * auVar77._12_4_ |
                                               (uint)!bVar73 * *(int *)(local_5f00.ray + 0x10c);
                                          bVar73 = (bool)((byte)(uVar63 >> 4) & 1);
                                          auVar105._16_4_ =
                                               (uint)bVar73 * auVar77._16_4_ |
                                               (uint)!bVar73 * *(int *)(local_5f00.ray + 0x110);
                                          bVar73 = (bool)((byte)(uVar63 >> 5) & 1);
                                          auVar105._20_4_ =
                                               (uint)bVar73 * auVar77._20_4_ |
                                               (uint)!bVar73 * *(int *)(local_5f00.ray + 0x114);
                                          bVar73 = (bool)((byte)(uVar63 >> 6) & 1);
                                          auVar105._24_4_ =
                                               (uint)bVar73 * auVar77._24_4_ |
                                               (uint)!bVar73 * *(int *)(local_5f00.ray + 0x118);
                                          bVar73 = SUB81(uVar63 >> 7,0);
                                          auVar105._28_4_ =
                                               (uint)bVar73 * auVar77._28_4_ |
                                               (uint)!bVar73 * *(int *)(local_5f00.ray + 0x11c);
                                          *(undefined1 (*) [32])(local_5f00.ray + 0x100) = auVar105;
                                          bVar52 = local_5ec0[0];
                                        }
                                        bVar73 = (bool)((byte)uVar63 & 1);
                                        bVar15 = (bool)((byte)(uVar63 >> 1) & 1);
                                        bVar16 = (bool)((byte)(uVar63 >> 2) & 1);
                                        bVar17 = (bool)((byte)(uVar63 >> 3) & 1);
                                        bVar18 = (bool)((byte)(uVar63 >> 4) & 1);
                                        bVar19 = (bool)((byte)(uVar63 >> 5) & 1);
                                        bVar20 = (bool)((byte)(uVar63 >> 6) & 1);
                                        bVar21 = SUB81(uVar63 >> 7,0);
                                        *(uint *)local_5f38 =
                                             (uint)bVar73 * *(int *)local_5f38 |
                                             (uint)!bVar73 * local_5ea0._0_4_;
                                        *(uint *)(local_5f38 + 4) =
                                             (uint)bVar15 * *(int *)(local_5f38 + 4) |
                                             (uint)!bVar15 * local_5ea0._4_4_;
                                        *(uint *)(local_5f38 + 8) =
                                             (uint)bVar16 * *(int *)(local_5f38 + 8) |
                                             (uint)!bVar16 * local_5ea0._8_4_;
                                        *(uint *)(local_5f38 + 0xc) =
                                             (uint)bVar17 * *(int *)(local_5f38 + 0xc) |
                                             (uint)!bVar17 * local_5ea0._12_4_;
                                        *(uint *)(local_5f38 + 0x10) =
                                             (uint)bVar18 * *(int *)(local_5f38 + 0x10) |
                                             (uint)!bVar18 * local_5ea0._16_4_;
                                        *(uint *)(local_5f38 + 0x14) =
                                             (uint)bVar19 * *(int *)(local_5f38 + 0x14) |
                                             (uint)!bVar19 * local_5ea0._20_4_;
                                        *(uint *)(local_5f38 + 0x18) =
                                             (uint)bVar20 * *(int *)(local_5f38 + 0x18) |
                                             (uint)!bVar20 * local_5ea0._24_4_;
                                        *(uint *)(local_5f38 + 0x1c) =
                                             (uint)bVar21 * *(int *)(local_5f38 + 0x1c) |
                                             (uint)!bVar21 * local_5ea0._28_4_;
                                        lVar64 = local_5f88;
                                        auVar91 = local_5ce0;
                                        auVar93 = local_5cc0;
                                        auVar84 = local_5d80;
                                        auVar92 = local_5d60;
                                        auVar83 = local_5f20;
                                      }
                                      bVar71 = ~(byte)uVar63 & bVar52;
                                    }
                                    bVar52 = bVar52 & ~bVar57;
                                  }
                                  if (bVar52 == 0) {
                                    in_ZMM30 = ZEXT3264(auVar83);
                                    in_ZMM29 = ZEXT3264(auVar84);
                                    in_ZMM27 = ZEXT3264(_local_5f60);
                                    local_5ea0 = auVar93;
                                    local_5f20 = auVar91;
                                    bVar52 = bVar71;
                                  }
                                  else {
                                    local_5da0 = in_ZMM10._0_32_;
                                    local_5d80 = auVar84;
                                    local_5d60 = auVar92;
                                    auVar79 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                                    auVar77 = *(undefined1 (*) [32])pRVar65;
                                    auVar78 = *(undefined1 (*) [32])(pRVar65 + 0x20);
                                    auVar76 = *(undefined1 (*) [32])(pRVar65 + 0x40);
                                    auVar94 = *(undefined1 (*) [32])(pRVar65 + 0x80);
                                    auVar95 = *(undefined1 (*) [32])(pRVar65 + 0xa0);
                                    auVar123 = *(undefined1 (*) [32])(pRVar65 + 0xc0);
                                    auVar137 = ZEXT3264(auVar123);
                                    auVar50._4_4_ = uStack_587c;
                                    auVar50._0_4_ = local_5880;
                                    auVar50._8_4_ = uStack_5878;
                                    auVar50._12_4_ = uStack_5874;
                                    auVar50._16_4_ = uStack_5870;
                                    auVar50._20_4_ = uStack_586c;
                                    auVar50._24_4_ = uStack_5868;
                                    auVar50._28_4_ = uStack_5864;
                                    auVar129 = vsubps_avx(auVar50,auVar77);
                                    auVar49._4_4_ = uStack_589c;
                                    auVar49._0_4_ = local_58a0;
                                    auVar49._8_4_ = uStack_5898;
                                    auVar49._12_4_ = uStack_5894;
                                    auVar49._16_4_ = uStack_5890;
                                    auVar49._20_4_ = uStack_588c;
                                    auVar49._24_4_ = uStack_5888;
                                    auVar49._28_4_ = uStack_5884;
                                    auVar130 = vsubps_avx(auVar49,auVar78);
                                    auVar48._4_4_ = uStack_58bc;
                                    auVar48._0_4_ = local_58c0;
                                    auVar48._8_4_ = uStack_58b8;
                                    auVar48._12_4_ = uStack_58b4;
                                    auVar48._16_4_ = uStack_58b0;
                                    auVar48._20_4_ = uStack_58ac;
                                    auVar48._24_4_ = uStack_58a8;
                                    auVar48._28_4_ = uStack_58a4;
                                    auVar131 = vsubps_avx(auVar48,auVar76);
                                    auVar88 = vsubps_avx(local_5e60,auVar77);
                                    auVar89 = vsubps_avx(local_5840,auVar78);
                                    auVar90 = vsubps_avx(local_5860,auVar76);
                                    auVar77 = vsubps_avx(local_5e00,auVar77);
                                    auVar80 = vsubps_avx512vl(local_5e20,auVar78);
                                    auVar81 = vsubps_avx512vl(local_5e40,auVar76);
                                    auVar78 = vsubps_avx(auVar77,auVar129);
                                    auVar82 = vsubps_avx512vl(auVar80,auVar130);
                                    auVar85 = vsubps_avx512vl(auVar81,auVar131);
                                    auVar139 = ZEXT3264(auVar85);
                                    auVar76 = vsubps_avx(auVar129,auVar88);
                                    in_ZMM9 = ZEXT3264(auVar76);
                                    auVar102 = vsubps_avx(auVar130,auVar89);
                                    auVar23 = vsubps_avx(auVar131,auVar90);
                                    auVar86 = vsubps_avx512vl(auVar88,auVar77);
                                    auVar143 = auVar151._0_32_;
                                    auVar87 = vsubps_avx512vl(auVar89,auVar80);
                                    auVar97 = vsubps_avx512vl(auVar90,auVar81);
                                    auVar84 = vaddps_avx512vl(auVar77,auVar129);
                                    auVar98 = vaddps_avx512vl(auVar80,auVar130);
                                    auVar99 = vaddps_avx512vl(auVar81,auVar131);
                                    auVar100 = vmulps_avx512vl(auVar98,auVar85);
                                    auVar100 = vfmsub231ps_avx512vl(auVar100,auVar82,auVar99);
                                    auVar99 = vmulps_avx512vl(auVar99,auVar78);
                                    auVar99 = vfmsub231ps_avx512vl(auVar99,auVar85,auVar84);
                                    auVar84 = vmulps_avx512vl(auVar84,auVar82);
                                    auVar84 = vfmsub231ps_avx512vl(auVar84,auVar78,auVar98);
                                    auVar84 = vmulps_avx512vl(auVar84,auVar123);
                                    auVar84 = vfmadd231ps_avx512vl(auVar84,auVar95,auVar99);
                                    auVar98 = vfmadd231ps_avx512vl(auVar84,auVar94,auVar100);
                                    auVar84 = vaddps_avx512vl(auVar129,auVar88);
                                    auVar99 = vaddps_avx512vl(auVar130,auVar89);
                                    auVar100 = vaddps_avx512vl(auVar131,auVar90);
                                    auVar101 = vmulps_avx512vl(auVar99,auVar23);
                                    auVar101 = vfmsub231ps_avx512vl(auVar101,auVar102,auVar100);
                                    auVar100 = vmulps_avx512vl(auVar100,auVar76);
                                    auVar100 = vfmsub231ps_avx512vl(auVar100,auVar23,auVar84);
                                    auVar84 = vmulps_avx512vl(auVar84,auVar102);
                                    auVar84 = vfmsub231ps_avx512vl(auVar84,auVar76,auVar99);
                                    auVar84 = vmulps_avx512vl(auVar84,auVar123);
                                    auVar151 = ZEXT3264(auVar143);
                                    auVar84 = vfmadd231ps_avx512vl(auVar84,auVar95,auVar100);
                                    auVar84 = vfmadd231ps_avx512vl(auVar84,auVar94,auVar101);
                                    auVar144._0_4_ = auVar88._0_4_ + auVar77._0_4_;
                                    auVar144._4_4_ = auVar88._4_4_ + auVar77._4_4_;
                                    auVar144._8_4_ = auVar88._8_4_ + auVar77._8_4_;
                                    auVar144._12_4_ = auVar88._12_4_ + auVar77._12_4_;
                                    auVar144._16_4_ = auVar88._16_4_ + auVar77._16_4_;
                                    auVar144._20_4_ = auVar88._20_4_ + auVar77._20_4_;
                                    auVar144._24_4_ = auVar88._24_4_ + auVar77._24_4_;
                                    auVar144._28_4_ = auVar88._28_4_ + auVar77._28_4_;
                                    auVar77 = vaddps_avx512vl(auVar89,auVar80);
                                    auVar88 = vaddps_avx512vl(auVar90,auVar81);
                                    auVar89 = vmulps_avx512vl(auVar77,auVar97);
                                    auVar89 = vfmsub231ps_avx512vl(auVar89,auVar87,auVar88);
                                    auVar88 = vmulps_avx512vl(auVar88,auVar86);
                                    auVar88 = vfmsub231ps_avx512vl(auVar88,auVar97,auVar144);
                                    auVar90 = vmulps_avx512vl(auVar144,auVar87);
                                    auVar77 = vfmsub231ps_avx512vl(auVar90,auVar86,auVar77);
                                    auVar41._4_4_ = auVar77._4_4_ * auVar123._4_4_;
                                    auVar41._0_4_ = auVar77._0_4_ * auVar123._0_4_;
                                    auVar41._8_4_ = auVar77._8_4_ * auVar123._8_4_;
                                    auVar41._12_4_ = auVar77._12_4_ * auVar123._12_4_;
                                    auVar41._16_4_ = auVar77._16_4_ * auVar123._16_4_;
                                    auVar41._20_4_ = auVar77._20_4_ * auVar123._20_4_;
                                    auVar41._24_4_ = auVar77._24_4_ * auVar123._24_4_;
                                    auVar41._28_4_ = auVar77._28_4_;
                                    auVar109 = vfmadd231ps_fma(auVar41,auVar95,auVar88);
                                    auVar109 = vfmadd231ps_fma(ZEXT1632(auVar109),auVar94,auVar89);
                                    auVar77 = vaddps_avx512vl(auVar98,auVar84);
                                    auVar145._0_4_ = auVar109._0_4_ + auVar77._0_4_;
                                    auVar145._4_4_ = auVar109._4_4_ + auVar77._4_4_;
                                    auVar145._8_4_ = auVar109._8_4_ + auVar77._8_4_;
                                    auVar145._12_4_ = auVar109._12_4_ + auVar77._12_4_;
                                    auVar145._16_4_ = auVar77._16_4_ + 0.0;
                                    auVar145._20_4_ = auVar77._20_4_ + 0.0;
                                    auVar145._24_4_ = auVar77._24_4_ + 0.0;
                                    auVar145._28_4_ = auVar77._28_4_ + 0.0;
                                    auVar90 = auVar147._0_32_;
                                    vandps_avx512vl(auVar145,auVar90);
                                    auVar29._8_4_ = 0x34000000;
                                    auVar29._0_8_ = 0x3400000034000000;
                                    auVar29._12_4_ = 0x34000000;
                                    auVar29._16_4_ = 0x34000000;
                                    auVar29._20_4_ = 0x34000000;
                                    auVar29._24_4_ = 0x34000000;
                                    auVar29._28_4_ = 0x34000000;
                                    auVar88 = vmulps_avx512vl(auVar145,auVar29);
                                    auVar77 = vminps_avx512vl(auVar98,auVar84);
                                    auVar77 = vminps_avx(auVar77,ZEXT1632(auVar109));
                                    auVar89 = vxorps_avx512vl(auVar88,auVar143);
                                    uVar25 = vcmpps_avx512vl(auVar77,auVar89,5);
                                    auVar89 = vmaxps_avx512vl(auVar98,auVar84);
                                    auVar77 = vmaxps_avx(auVar89,ZEXT1632(auVar109));
                                    uVar26 = vcmpps_avx512vl(auVar77,auVar88,2);
                                    bVar52 = ((byte)uVar25 | (byte)uVar26) & bVar71;
                                    uVar72 = (uint)bVar52;
                                    if (bVar52 == 0) {
LAB_0088d885:
                                      local_5ea0 = auVar93;
                                      auVar77 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                                      auVar78 = vbroadcastss_avx512vl(ZEXT416(0x3f7ffffa));
                                      auVar76 = vbroadcastss_avx512vl(ZEXT416(0x3f800003));
                                      local_5e40 = local_5da0;
                                      auVar92 = local_5d60;
                                      auVar84 = local_5d80;
                                      local_5f20 = auVar91;
                                    }
                                    else {
                                      auVar42._4_4_ = auVar102._4_4_ * auVar85._4_4_;
                                      auVar42._0_4_ = auVar102._0_4_ * auVar85._0_4_;
                                      auVar42._8_4_ = auVar102._8_4_ * auVar85._8_4_;
                                      auVar42._12_4_ = auVar102._12_4_ * auVar85._12_4_;
                                      auVar42._16_4_ = auVar102._16_4_ * auVar85._16_4_;
                                      auVar42._20_4_ = auVar102._20_4_ * auVar85._20_4_;
                                      auVar42._24_4_ = auVar102._24_4_ * auVar85._24_4_;
                                      auVar42._28_4_ = auVar77._28_4_;
                                      auVar43._4_4_ = auVar23._4_4_ * auVar78._4_4_;
                                      auVar43._0_4_ = auVar23._0_4_ * auVar78._0_4_;
                                      auVar43._8_4_ = auVar23._8_4_ * auVar78._8_4_;
                                      auVar43._12_4_ = auVar23._12_4_ * auVar78._12_4_;
                                      auVar43._16_4_ = auVar23._16_4_ * auVar78._16_4_;
                                      auVar43._20_4_ = auVar23._20_4_ * auVar78._20_4_;
                                      auVar43._24_4_ = auVar23._24_4_ * auVar78._24_4_;
                                      auVar43._28_4_ = auVar88._28_4_;
                                      auVar44._4_4_ = auVar76._4_4_ * auVar82._4_4_;
                                      auVar44._0_4_ = auVar76._0_4_ * auVar82._0_4_;
                                      auVar44._8_4_ = auVar76._8_4_ * auVar82._8_4_;
                                      auVar44._12_4_ = auVar76._12_4_ * auVar82._12_4_;
                                      auVar44._16_4_ = auVar76._16_4_ * auVar82._16_4_;
                                      auVar44._20_4_ = auVar76._20_4_ * auVar82._20_4_;
                                      auVar44._24_4_ = auVar76._24_4_ * auVar82._24_4_;
                                      auVar44._28_4_ = auVar89._28_4_;
                                      auVar77 = vmulps_avx512vl(auVar87,auVar23);
                                      auVar88 = vmulps_avx512vl(auVar76,auVar97);
                                      auVar89 = vmulps_avx512vl(auVar86,auVar102);
                                      auVar109 = vfmsub213ps_fma(auVar82,auVar23,auVar42);
                                      auVar75 = vfmsub213ps_fma(auVar85,auVar76,auVar43);
                                      auVar139 = ZEXT1664(auVar75);
                                      auVar146 = vfmsub213ps_fma(auVar78,auVar102,auVar44);
                                      auVar78 = vfmsub213ps_avx512vl(auVar97,auVar102,auVar77);
                                      auVar102 = vfmsub213ps_avx512vl(auVar86,auVar23,auVar88);
                                      auVar76 = vfmsub213ps_avx512vl(auVar87,auVar76,auVar89);
                                      vandps_avx512vl(auVar42,auVar90);
                                      vandps_avx512vl(auVar77,auVar90);
                                      uVar63 = vcmpps_avx512vl(auVar76,auVar76,1);
                                      vandps_avx512vl(auVar43,auVar90);
                                      vandps_avx512vl(auVar88,auVar90);
                                      uVar56 = vcmpps_avx512vl(auVar76,auVar76,1);
                                      vandps_avx512vl(auVar44,auVar90);
                                      in_ZMM9 = ZEXT3264(auVar76);
                                      vandps_avx512vl(auVar89,auVar90);
                                      uVar24 = vcmpps_avx512vl(auVar76,auVar76,1);
                                      bVar73 = (bool)((byte)uVar63 & 1);
                                      local_5f20._0_4_ =
                                           (uint)bVar73 * auVar109._0_4_ |
                                           (uint)!bVar73 * auVar78._0_4_;
                                      bVar73 = (bool)((byte)(uVar63 >> 1) & 1);
                                      local_5f20._4_4_ =
                                           (uint)bVar73 * auVar109._4_4_ |
                                           (uint)!bVar73 * auVar78._4_4_;
                                      bVar73 = (bool)((byte)(uVar63 >> 2) & 1);
                                      local_5f20._8_4_ =
                                           (uint)bVar73 * auVar109._8_4_ |
                                           (uint)!bVar73 * auVar78._8_4_;
                                      bVar73 = (bool)((byte)(uVar63 >> 3) & 1);
                                      local_5f20._12_4_ =
                                           (uint)bVar73 * auVar109._12_4_ |
                                           (uint)!bVar73 * auVar78._12_4_;
                                      local_5f20._16_4_ =
                                           (uint)!(bool)((byte)(uVar63 >> 4) & 1) * auVar78._16_4_;
                                      local_5f20._20_4_ =
                                           (uint)!(bool)((byte)(uVar63 >> 5) & 1) * auVar78._20_4_;
                                      local_5f20._24_4_ =
                                           (uint)!(bool)((byte)(uVar63 >> 6) & 1) * auVar78._24_4_;
                                      local_5f20._28_4_ =
                                           (uint)!SUB81(uVar63 >> 7,0) * auVar78._28_4_;
                                      bVar73 = (bool)((byte)uVar56 & 1);
                                      auVar92._0_4_ =
                                           (uint)bVar73 * auVar75._0_4_ |
                                           (uint)!bVar73 * auVar102._0_4_;
                                      bVar73 = (bool)((byte)(uVar56 >> 1) & 1);
                                      auVar92._4_4_ =
                                           (uint)bVar73 * auVar75._4_4_ |
                                           (uint)!bVar73 * auVar102._4_4_;
                                      bVar73 = (bool)((byte)(uVar56 >> 2) & 1);
                                      auVar92._8_4_ =
                                           (uint)bVar73 * auVar75._8_4_ |
                                           (uint)!bVar73 * auVar102._8_4_;
                                      bVar73 = (bool)((byte)(uVar56 >> 3) & 1);
                                      auVar92._12_4_ =
                                           (uint)bVar73 * auVar75._12_4_ |
                                           (uint)!bVar73 * auVar102._12_4_;
                                      auVar92._16_4_ =
                                           (uint)!(bool)((byte)(uVar56 >> 4) & 1) * auVar102._16_4_;
                                      auVar92._20_4_ =
                                           (uint)!(bool)((byte)(uVar56 >> 5) & 1) * auVar102._20_4_;
                                      auVar92._24_4_ =
                                           (uint)!(bool)((byte)(uVar56 >> 6) & 1) * auVar102._24_4_;
                                      auVar92._28_4_ = (uint)!SUB81(uVar56 >> 7,0) * auVar102._28_4_
                                      ;
                                      bVar73 = (bool)((byte)uVar24 & 1);
                                      local_5ea0._0_4_ =
                                           (uint)bVar73 * auVar146._0_4_ |
                                           (uint)!bVar73 * auVar76._0_4_;
                                      bVar73 = (bool)((byte)(uVar24 >> 1) & 1);
                                      local_5ea0._4_4_ =
                                           (uint)bVar73 * auVar146._4_4_ |
                                           (uint)!bVar73 * auVar76._4_4_;
                                      bVar73 = (bool)((byte)(uVar24 >> 2) & 1);
                                      local_5ea0._8_4_ =
                                           (uint)bVar73 * auVar146._8_4_ |
                                           (uint)!bVar73 * auVar76._8_4_;
                                      bVar73 = (bool)((byte)(uVar24 >> 3) & 1);
                                      local_5ea0._12_4_ =
                                           (uint)bVar73 * auVar146._12_4_ |
                                           (uint)!bVar73 * auVar76._12_4_;
                                      local_5ea0._16_4_ =
                                           (uint)!(bool)((byte)(uVar24 >> 4) & 1) * auVar76._16_4_;
                                      local_5ea0._20_4_ =
                                           (uint)!(bool)((byte)(uVar24 >> 5) & 1) * auVar76._20_4_;
                                      local_5ea0._24_4_ =
                                           (uint)!(bool)((byte)(uVar24 >> 6) & 1) * auVar76._24_4_;
                                      local_5ea0._28_4_ =
                                           (uint)!SUB81(uVar24 >> 7,0) * auVar76._28_4_;
                                      auVar77 = vmulps_avx512vl(auVar123,local_5ea0);
                                      auVar137 = ZEXT3264(auVar77);
                                      auVar77 = vfmadd213ps_avx512vl(auVar95,auVar92,auVar77);
                                      auVar77 = vfmadd213ps_avx512vl(auVar94,local_5f20,auVar77);
                                      auVar133._0_4_ = auVar77._0_4_ + auVar77._0_4_;
                                      auVar133._4_4_ = auVar77._4_4_ + auVar77._4_4_;
                                      auVar133._8_4_ = auVar77._8_4_ + auVar77._8_4_;
                                      auVar133._12_4_ = auVar77._12_4_ + auVar77._12_4_;
                                      auVar133._16_4_ = auVar77._16_4_ + auVar77._16_4_;
                                      auVar133._20_4_ = auVar77._20_4_ + auVar77._20_4_;
                                      auVar133._24_4_ = auVar77._24_4_ + auVar77._24_4_;
                                      auVar133._28_4_ = auVar77._28_4_ + auVar77._28_4_;
                                      auVar77 = vmulps_avx512vl(auVar131,local_5ea0);
                                      auVar77 = vfmadd213ps_avx512vl(auVar130,auVar92,auVar77);
                                      auVar77 = vfmadd213ps_avx512vl(auVar129,local_5f20,auVar77);
                                      auVar78 = vrcp14ps_avx512vl(auVar133);
                                      auVar94 = vxorps_avx512vl(auVar133,auVar143);
                                      auVar95 = vfnmadd213ps_avx512vl(auVar78,auVar133,auVar79);
                                      auVar109 = vfmadd132ps_fma(auVar95,auVar78,auVar78);
                                      local_5e40._4_4_ =
                                           (auVar77._4_4_ + auVar77._4_4_) * auVar109._4_4_;
                                      local_5e40._0_4_ =
                                           (auVar77._0_4_ + auVar77._0_4_) * auVar109._0_4_;
                                      local_5e40._8_4_ =
                                           (auVar77._8_4_ + auVar77._8_4_) * auVar109._8_4_;
                                      local_5e40._12_4_ =
                                           (auVar77._12_4_ + auVar77._12_4_) * auVar109._12_4_;
                                      local_5e40._16_4_ = (auVar77._16_4_ + auVar77._16_4_) * 0.0;
                                      local_5e40._20_4_ = (auVar77._20_4_ + auVar77._20_4_) * 0.0;
                                      local_5e40._24_4_ = (auVar77._24_4_ + auVar77._24_4_) * 0.0;
                                      local_5e40._28_4_ = auVar76._28_4_;
                                      uVar25 = vcmpps_avx512vl(local_5e40,
                                                               *(undefined1 (*) [32])
                                                                (pRVar65 + 0x100),2);
                                      uVar26 = vcmpps_avx512vl(local_5e40,
                                                               *(undefined1 (*) [32])
                                                                (pRVar65 + 0x60),0xd);
                                      uVar27 = vcmpps_avx512vl(auVar133,auVar94,4);
                                      bVar52 = bVar52 & (byte)uVar25 & (byte)uVar26 & (byte)uVar27;
                                      uVar72 = (uint)bVar52;
                                      if (bVar52 == 0) goto LAB_0088d885;
                                      auVar77 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                                      auVar78 = vbroadcastss_avx512vl(ZEXT416(0x3f7ffffa));
                                      auVar76 = vbroadcastss_avx512vl(ZEXT416(0x3f800003));
                                      _local_5f60 = auVar145;
                                      auVar83 = auVar98;
                                    }
                                    in_ZMM30 = ZEXT3264(auVar83);
                                    in_ZMM29 = ZEXT3264(auVar84);
                                    in_ZMM27 = ZEXT3264(_local_5f60);
                                    auVar150 = ZEXT3264(auVar76);
                                    auVar149 = ZEXT3264(auVar78);
                                    auVar148 = ZEXT3264(auVar77);
                                    in_ZMM10 = ZEXT3264(local_5e40);
                                    bVar57 = (byte)uVar72;
                                    bVar52 = bVar71;
                                    if (bVar57 != 0) {
                                      auVar77 = vsubps_avx512vl(_local_5f60,auVar83);
                                      auVar78 = vsubps_avx512vl(_local_5f60,auVar84);
                                      auVar146 = auVar147._0_16_;
                                      auVar109 = vcvtsi2ss_avx512f(auVar146,*(ushort *)
                                                                             (lVar64 + 8 + lVar58) -
                                                                            1);
                                      auVar122._4_12_ = ZEXT812(0) << 0x20;
                                      auVar122._0_4_ = auVar109._0_4_;
                                      auVar75 = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar122);
                                      auVar109 = vfnmadd213ss_fma(auVar109,auVar75,
                                                                  SUB6416(ZEXT464(0x40000000),0));
                                      fVar108 = auVar75._0_4_ * auVar109._0_4_;
                                      auVar109 = vcvtsi2ss_avx512f(auVar146,*(ushort *)
                                                                             (lVar64 + 10 + lVar58)
                                                                            - 1);
                                      auVar128._4_12_ = ZEXT812(0) << 0x20;
                                      auVar128._0_4_ = auVar109._0_4_;
                                      auVar75 = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar128);
                                      auVar109 = vfnmadd213ss_fma(auVar109,auVar75,
                                                                  SUB6416(ZEXT464(0x40000000),0));
                                      fVar22 = auVar75._0_4_ * auVar109._0_4_;
                                      auVar109 = vcvtsi2ss_avx512f(auVar146,((uint)uVar74 & 1) +
                                                                            uVar54);
                                      auVar134._0_4_ = auVar109._0_4_;
                                      auVar134._4_4_ = auVar134._0_4_;
                                      auVar134._8_4_ = auVar134._0_4_;
                                      auVar134._12_4_ = auVar134._0_4_;
                                      auVar134._16_4_ = auVar134._0_4_;
                                      auVar134._20_4_ = auVar134._0_4_;
                                      auVar134._24_4_ = auVar134._0_4_;
                                      auVar134._28_4_ = auVar134._0_4_;
                                      auVar76 = vmulps_avx512vl(auVar134,_local_5f60);
                                      auVar76 = vaddps_avx512vl(auVar77,auVar76);
                                      auVar118._4_4_ = fVar108;
                                      auVar118._0_4_ = fVar108;
                                      auVar118._8_4_ = fVar108;
                                      auVar118._12_4_ = fVar108;
                                      auVar118._16_4_ = fVar108;
                                      auVar118._20_4_ = fVar108;
                                      auVar118._24_4_ = fVar108;
                                      auVar118._28_4_ = fVar108;
                                      auVar76 = vmulps_avx512vl(auVar76,auVar118);
                                      auVar103._0_4_ =
                                           (uint)(bVar57 & 1) * auVar76._0_4_ |
                                           (uint)!(bool)(bVar57 & 1) * auVar77._0_4_;
                                      bVar73 = (bool)((byte)(uVar72 >> 1) & 1);
                                      auVar103._4_4_ =
                                           (uint)bVar73 * auVar76._4_4_ |
                                           (uint)!bVar73 * auVar77._4_4_;
                                      bVar73 = (bool)((byte)(uVar72 >> 2) & 1);
                                      auVar103._8_4_ =
                                           (uint)bVar73 * auVar76._8_4_ |
                                           (uint)!bVar73 * auVar77._8_4_;
                                      bVar73 = (bool)((byte)(uVar72 >> 3) & 1);
                                      auVar103._12_4_ =
                                           (uint)bVar73 * auVar76._12_4_ |
                                           (uint)!bVar73 * auVar77._12_4_;
                                      bVar73 = (bool)((byte)(uVar72 >> 4) & 1);
                                      auVar103._16_4_ =
                                           (uint)bVar73 * auVar76._16_4_ |
                                           (uint)!bVar73 * auVar77._16_4_;
                                      bVar73 = (bool)((byte)(uVar72 >> 5) & 1);
                                      auVar103._20_4_ =
                                           (uint)bVar73 * auVar76._20_4_ |
                                           (uint)!bVar73 * auVar77._20_4_;
                                      bVar73 = (bool)((byte)(uVar72 >> 6) & 1);
                                      auVar103._24_4_ =
                                           (uint)bVar73 * auVar76._24_4_ |
                                           (uint)!bVar73 * auVar77._24_4_;
                                      auVar103._28_4_ =
                                           (uVar72 >> 7) * auVar76._28_4_ |
                                           (uint)!SUB41(uVar72 >> 7,0) * auVar77._28_4_;
                                      in_ZMM30 = ZEXT3264(auVar103);
                                      auVar109 = vcvtsi2ss_avx512f(auVar146,((uint)(uVar74 >> 1) &
                                                                            0x7fffffff) + local_5f7c
                                                                  );
                                      auVar119._0_4_ = auVar109._0_4_;
                                      auVar119._4_4_ = auVar119._0_4_;
                                      auVar119._8_4_ = auVar119._0_4_;
                                      auVar119._12_4_ = auVar119._0_4_;
                                      auVar119._16_4_ = auVar119._0_4_;
                                      auVar119._20_4_ = auVar119._0_4_;
                                      auVar119._24_4_ = auVar119._0_4_;
                                      auVar119._28_4_ = auVar119._0_4_;
                                      auVar77 = vmulps_avx512vl(auVar119,_local_5f60);
                                      auVar77 = vaddps_avx512vl(auVar78,auVar77);
                                      auVar125._4_4_ = fVar22;
                                      auVar125._0_4_ = fVar22;
                                      auVar125._8_4_ = fVar22;
                                      auVar125._12_4_ = fVar22;
                                      auVar125._16_4_ = fVar22;
                                      auVar125._20_4_ = fVar22;
                                      auVar125._24_4_ = fVar22;
                                      auVar125._28_4_ = fVar22;
                                      auVar77 = vmulps_avx512vl(auVar77,auVar125);
                                      local_5e00._0_4_ =
                                           (uint)(bVar57 & 1) * auVar77._0_4_ |
                                           (uint)!(bool)(bVar57 & 1) * auVar78._0_4_;
                                      bVar73 = (bool)((byte)(uVar72 >> 1) & 1);
                                      local_5e00._4_4_ =
                                           (uint)bVar73 * auVar77._4_4_ |
                                           (uint)!bVar73 * auVar78._4_4_;
                                      bVar73 = (bool)((byte)(uVar72 >> 2) & 1);
                                      local_5e00._8_4_ =
                                           (uint)bVar73 * auVar77._8_4_ |
                                           (uint)!bVar73 * auVar78._8_4_;
                                      bVar73 = (bool)((byte)(uVar72 >> 3) & 1);
                                      local_5e00._12_4_ =
                                           (uint)bVar73 * auVar77._12_4_ |
                                           (uint)!bVar73 * auVar78._12_4_;
                                      bVar73 = (bool)((byte)(uVar72 >> 4) & 1);
                                      local_5e00._16_4_ =
                                           (uint)bVar73 * auVar77._16_4_ |
                                           (uint)!bVar73 * auVar78._16_4_;
                                      bVar73 = (bool)((byte)(uVar72 >> 5) & 1);
                                      local_5e00._20_4_ =
                                           (uint)bVar73 * auVar77._20_4_ |
                                           (uint)!bVar73 * auVar78._20_4_;
                                      bVar73 = (bool)((byte)(uVar72 >> 6) & 1);
                                      local_5e00._24_4_ =
                                           (uint)bVar73 * auVar77._24_4_ |
                                           (uint)!bVar73 * auVar78._24_4_;
                                      local_5e00._28_4_ =
                                           (uVar72 >> 7) * auVar77._28_4_ |
                                           (uint)!SUB41(uVar72 >> 7,0) * auVar78._28_4_;
                                      in_ZMM29 = ZEXT3264(local_5e00);
                                      pGVar11 = (context->scene->geometries).items
                                                [*(uint *)(local_5d20 + uVar74 * 4)].ptr;
                                      uVar72 = pGVar11->mask;
                                      auVar120._4_4_ = uVar72;
                                      auVar120._0_4_ = uVar72;
                                      auVar120._8_4_ = uVar72;
                                      auVar120._12_4_ = uVar72;
                                      auVar120._16_4_ = uVar72;
                                      auVar120._20_4_ = uVar72;
                                      auVar120._24_4_ = uVar72;
                                      auVar120._28_4_ = uVar72;
                                      uVar25 = vptestmd_avx512vl(auVar120,*(undefined1 (*) [32])
                                                                           (pRVar65 + 0x120));
                                      bVar57 = (byte)uVar25 & bVar57;
                                      uVar63 = (ulong)bVar57;
                                      if (bVar57 != 0) {
                                        if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                                           (pGVar11->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                                          vandps_avx512vl(_local_5f60,auVar90);
                                          auVar30._8_4_ = 0x219392ef;
                                          auVar30._0_8_ = 0x219392ef219392ef;
                                          auVar30._12_4_ = 0x219392ef;
                                          auVar30._16_4_ = 0x219392ef;
                                          auVar30._20_4_ = 0x219392ef;
                                          auVar30._24_4_ = 0x219392ef;
                                          auVar30._28_4_ = 0x219392ef;
                                          uVar63 = vcmpps_avx512vl(local_5e00,auVar30,5);
                                          auVar77 = vrcp14ps_avx512vl(_local_5f60);
                                          auVar136._8_4_ = 0x3f800000;
                                          auVar136._0_8_ = &DAT_3f8000003f800000;
                                          auVar136._12_4_ = 0x3f800000;
                                          auVar136._16_4_ = 0x3f800000;
                                          auVar136._20_4_ = 0x3f800000;
                                          auVar136._24_4_ = 0x3f800000;
                                          auVar136._28_4_ = 0x3f800000;
                                          auVar78 = vfnmadd213ps_avx512vl
                                                              (auVar77,_local_5f60,auVar136);
                                          auVar77 = vfmadd132ps_avx512vl(auVar78,auVar77,auVar77);
                                          auVar106._4_4_ =
                                               (uint)((byte)(uVar63 >> 1) & 1) * auVar77._4_4_;
                                          auVar106._0_4_ = (uint)((byte)uVar63 & 1) * auVar77._0_4_;
                                          auVar106._8_4_ =
                                               (uint)((byte)(uVar63 >> 2) & 1) * auVar77._8_4_;
                                          auVar106._12_4_ =
                                               (uint)((byte)(uVar63 >> 3) & 1) * auVar77._12_4_;
                                          auVar106._16_4_ =
                                               (uint)((byte)(uVar63 >> 4) & 1) * auVar77._16_4_;
                                          auVar106._20_4_ =
                                               (uint)((byte)(uVar63 >> 5) & 1) * auVar77._20_4_;
                                          auVar106._24_4_ =
                                               (uint)((byte)(uVar63 >> 6) & 1) * auVar77._24_4_;
                                          auVar106._28_4_ =
                                               (uint)(byte)(uVar63 >> 7) * auVar77._28_4_;
                                          auVar77 = vmulps_avx512vl(auVar103,auVar106);
                                          local_5a80 = vminps_avx(auVar77,auVar136);
                                          auVar77 = vmulps_avx512vl(local_5e00,auVar106);
                                          local_5a60 = vminps_avx(auVar77,auVar136);
                                          pRVar14 = context->user;
                                          local_5a20 = vpbroadcastd_avx512vl();
                                          local_5a40 = vpbroadcastd_avx512vl();
                                          local_5ae0[0] = (RTCHitN)local_5f20[0];
                                          local_5ae0[1] = (RTCHitN)local_5f20[1];
                                          local_5ae0[2] = (RTCHitN)local_5f20[2];
                                          local_5ae0[3] = (RTCHitN)local_5f20[3];
                                          local_5ae0[4] = (RTCHitN)local_5f20[4];
                                          local_5ae0[5] = (RTCHitN)local_5f20[5];
                                          local_5ae0[6] = (RTCHitN)local_5f20[6];
                                          local_5ae0[7] = (RTCHitN)local_5f20[7];
                                          local_5ae0[8] = (RTCHitN)local_5f20[8];
                                          local_5ae0[9] = (RTCHitN)local_5f20[9];
                                          local_5ae0[10] = (RTCHitN)local_5f20[10];
                                          local_5ae0[0xb] = (RTCHitN)local_5f20[0xb];
                                          local_5ae0[0xc] = (RTCHitN)local_5f20[0xc];
                                          local_5ae0[0xd] = (RTCHitN)local_5f20[0xd];
                                          local_5ae0[0xe] = (RTCHitN)local_5f20[0xe];
                                          local_5ae0[0xf] = (RTCHitN)local_5f20[0xf];
                                          local_5ae0[0x10] = (RTCHitN)local_5f20[0x10];
                                          local_5ae0[0x11] = (RTCHitN)local_5f20[0x11];
                                          local_5ae0[0x12] = (RTCHitN)local_5f20[0x12];
                                          local_5ae0[0x13] = (RTCHitN)local_5f20[0x13];
                                          local_5ae0[0x14] = (RTCHitN)local_5f20[0x14];
                                          local_5ae0[0x15] = (RTCHitN)local_5f20[0x15];
                                          local_5ae0[0x16] = (RTCHitN)local_5f20[0x16];
                                          local_5ae0[0x17] = (RTCHitN)local_5f20[0x17];
                                          local_5ae0[0x18] = (RTCHitN)local_5f20[0x18];
                                          local_5ae0[0x19] = (RTCHitN)local_5f20[0x19];
                                          local_5ae0[0x1a] = (RTCHitN)local_5f20[0x1a];
                                          local_5ae0[0x1b] = (RTCHitN)local_5f20[0x1b];
                                          local_5ae0[0x1c] = (RTCHitN)local_5f20[0x1c];
                                          local_5ae0[0x1d] = (RTCHitN)local_5f20[0x1d];
                                          local_5ae0[0x1e] = (RTCHitN)local_5f20[0x1e];
                                          local_5ae0[0x1f] = (RTCHitN)local_5f20[0x1f];
                                          local_5ac0 = auVar92;
                                          local_5aa0 = local_5ea0;
                                          auVar77 = vpcmpeqd_avx2(local_5a80,local_5a80);
                                          local_5ec8[1] = auVar77;
                                          *local_5ec8 = auVar77;
                                          local_5a00 = pRVar14->instID[0];
                                          uStack_59fc = local_5a00;
                                          uStack_59f8 = local_5a00;
                                          uStack_59f4 = local_5a00;
                                          uStack_59f0 = local_5a00;
                                          uStack_59ec = local_5a00;
                                          uStack_59e8 = local_5a00;
                                          uStack_59e4 = local_5a00;
                                          local_59e0 = pRVar14->instPrimID[0];
                                          uStack_59dc = local_59e0;
                                          uStack_59d8 = local_59e0;
                                          uStack_59d4 = local_59e0;
                                          uStack_59d0 = local_59e0;
                                          uStack_59cc = local_59e0;
                                          uStack_59c8 = local_59e0;
                                          uStack_59c4 = local_59e0;
                                          local_5e60 = *(undefined1 (*) [32])(pRVar65 + 0x100);
                                          auVar77 = vblendmps_avx512vl(local_5e60,local_5e40);
                                          bVar73 = (bool)(bVar57 >> 1 & 1);
                                          bVar15 = (bool)(bVar57 >> 2 & 1);
                                          bVar16 = (bool)(bVar57 >> 3 & 1);
                                          bVar17 = (bool)(bVar57 >> 4 & 1);
                                          bVar18 = (bool)(bVar57 >> 5 & 1);
                                          bVar19 = (bool)(bVar57 >> 6 & 1);
                                          *(uint *)(pRVar65 + 0x100) =
                                               (uint)(bVar57 & 1) * auVar77._0_4_ |
                                               !(bool)(bVar57 & 1) * local_59e0;
                                          *(uint *)(pRVar65 + 0x104) =
                                               (uint)bVar73 * auVar77._4_4_ | !bVar73 * local_59e0;
                                          *(uint *)(pRVar65 + 0x108) =
                                               (uint)bVar15 * auVar77._8_4_ | !bVar15 * local_59e0;
                                          *(uint *)(pRVar65 + 0x10c) =
                                               (uint)bVar16 * auVar77._12_4_ | !bVar16 * local_59e0;
                                          *(uint *)(pRVar65 + 0x110) =
                                               (uint)bVar17 * auVar77._16_4_ | !bVar17 * local_59e0;
                                          *(uint *)(pRVar65 + 0x114) =
                                               (uint)bVar18 * auVar77._20_4_ | !bVar18 * local_59e0;
                                          *(uint *)(pRVar65 + 0x118) =
                                               (uint)bVar19 * auVar77._24_4_ | !bVar19 * local_59e0;
                                          *(uint *)(pRVar65 + 0x11c) =
                                               (uint)(bVar57 >> 7) * auVar77._28_4_ |
                                               !(bool)(bVar57 >> 7) * local_59e0;
                                          local_5e80 = vpmovm2d_avx512vl((ulong)bVar57);
                                          local_5f00.geometryUserPtr = pGVar11->userPtr;
                                          local_5f00.valid = (int *)local_5e80;
                                          local_5f00.context = context->user;
                                          local_5f00.ray = (RTCRayN *)pRVar65;
                                          local_5f00.hit = local_5ae0;
                                          local_5f00.N = 8;
                                          local_5e20 = _local_5f60;
                                          local_5f88 = lVar64;
                                          local_5f78 = lVar58;
                                          _local_5f60 = auVar103;
                                          local_5ec0 = auVar92;
                                          if (pGVar11->occlusionFilterN != (RTCFilterFunctionN)0x0)
                                          {
                                            auVar139 = ZEXT1664(auVar139._0_16_);
                                            in_ZMM9 = ZEXT1664(in_ZMM9._0_16_);
                                            (*pGVar11->occlusionFilterN)(&local_5f00);
                                            in_ZMM10 = ZEXT3264(local_5e40);
                                            in_ZMM27 = ZEXT3264(local_5e20);
                                            in_ZMM29 = ZEXT3264(local_5e00);
                                            in_ZMM30 = ZEXT3264(_local_5f60);
                                            auVar77 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                                            auVar151 = ZEXT3264(auVar77);
                                            auVar77 = vbroadcastss_avx512vl(ZEXT416(0x3f800003));
                                            auVar150 = ZEXT3264(auVar77);
                                            auVar77 = vbroadcastss_avx512vl(ZEXT416(0x3f7ffffa));
                                            auVar149 = ZEXT3264(auVar77);
                                            auVar77 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                                            auVar148 = ZEXT3264(auVar77);
                                            auVar77 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                                            auVar147 = ZEXT3264(auVar77);
                                            pRVar65 = local_5f98;
                                            context = local_5f90;
                                          }
                                          auVar137 = ZEXT3264(local_5f20);
                                          uVar63 = vptestmd_avx512vl(local_5e80,local_5e80);
                                          auVar92 = local_5ec0;
                                          if ((char)uVar63 != '\0') {
                                            p_Var13 = context->args->filter;
                                            if ((p_Var13 != (RTCFilterFunctionN)0x0) &&
                                               (((context->args->flags &
                                                 RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                                 RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                                (((pGVar11->field_8).field_0x2 & 0x40) != 0)))) {
                                              auVar137 = ZEXT1664(local_5f20._0_16_);
                                              auVar139 = ZEXT1664(auVar139._0_16_);
                                              in_ZMM9 = ZEXT1664(in_ZMM9._0_16_);
                                              (*p_Var13)(&local_5f00);
                                              in_ZMM10 = ZEXT3264(local_5e40);
                                              in_ZMM27 = ZEXT3264(local_5e20);
                                              in_ZMM29 = ZEXT3264(local_5e00);
                                              in_ZMM30 = ZEXT3264(_local_5f60);
                                              auVar77 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                                              auVar151 = ZEXT3264(auVar77);
                                              auVar77 = vbroadcastss_avx512vl(ZEXT416(0x3f800003));
                                              auVar150 = ZEXT3264(auVar77);
                                              auVar77 = vbroadcastss_avx512vl(ZEXT416(0x3f7ffffa));
                                              auVar149 = ZEXT3264(auVar77);
                                              auVar77 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                                              auVar148 = ZEXT3264(auVar77);
                                              auVar77 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                                              auVar147 = ZEXT3264(auVar77);
                                              pRVar65 = local_5f98;
                                              context = local_5f90;
                                            }
                                            uVar63 = vptestmd_avx512vl(local_5e80,local_5e80);
                                            auVar77 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                                            bVar73 = (bool)((byte)uVar63 & 1);
                                            auVar107._0_4_ =
                                                 (uint)bVar73 * auVar77._0_4_ |
                                                 (uint)!bVar73 * *(int *)(local_5f00.ray + 0x100);
                                            bVar73 = (bool)((byte)(uVar63 >> 1) & 1);
                                            auVar107._4_4_ =
                                                 (uint)bVar73 * auVar77._4_4_ |
                                                 (uint)!bVar73 * *(int *)(local_5f00.ray + 0x104);
                                            bVar73 = (bool)((byte)(uVar63 >> 2) & 1);
                                            auVar107._8_4_ =
                                                 (uint)bVar73 * auVar77._8_4_ |
                                                 (uint)!bVar73 * *(int *)(local_5f00.ray + 0x108);
                                            bVar73 = (bool)((byte)(uVar63 >> 3) & 1);
                                            auVar107._12_4_ =
                                                 (uint)bVar73 * auVar77._12_4_ |
                                                 (uint)!bVar73 * *(int *)(local_5f00.ray + 0x10c);
                                            bVar73 = (bool)((byte)(uVar63 >> 4) & 1);
                                            auVar107._16_4_ =
                                                 (uint)bVar73 * auVar77._16_4_ |
                                                 (uint)!bVar73 * *(int *)(local_5f00.ray + 0x110);
                                            bVar73 = (bool)((byte)(uVar63 >> 5) & 1);
                                            auVar107._20_4_ =
                                                 (uint)bVar73 * auVar77._20_4_ |
                                                 (uint)!bVar73 * *(int *)(local_5f00.ray + 0x114);
                                            bVar73 = (bool)((byte)(uVar63 >> 6) & 1);
                                            auVar107._24_4_ =
                                                 (uint)bVar73 * auVar77._24_4_ |
                                                 (uint)!bVar73 * *(int *)(local_5f00.ray + 0x118);
                                            bVar73 = SUB81(uVar63 >> 7,0);
                                            auVar107._28_4_ =
                                                 (uint)bVar73 * auVar77._28_4_ |
                                                 (uint)!bVar73 * *(int *)(local_5f00.ray + 0x11c);
                                            *(undefined1 (*) [32])(local_5f00.ray + 0x100) =
                                                 auVar107;
                                            auVar92 = local_5ec0;
                                          }
                                          bVar73 = (bool)((byte)uVar63 & 1);
                                          bVar15 = (bool)((byte)(uVar63 >> 1) & 1);
                                          bVar16 = (bool)((byte)(uVar63 >> 2) & 1);
                                          bVar17 = (bool)((byte)(uVar63 >> 3) & 1);
                                          bVar18 = (bool)((byte)(uVar63 >> 4) & 1);
                                          bVar19 = (bool)((byte)(uVar63 >> 5) & 1);
                                          bVar20 = (bool)((byte)(uVar63 >> 6) & 1);
                                          bVar21 = SUB81(uVar63 >> 7,0);
                                          *(uint *)local_5f38 =
                                               (uint)bVar73 * *(int *)local_5f38 |
                                               (uint)!bVar73 * local_5e60._0_4_;
                                          *(uint *)(local_5f38 + 4) =
                                               (uint)bVar15 * *(int *)(local_5f38 + 4) |
                                               (uint)!bVar15 * local_5e60._4_4_;
                                          *(uint *)(local_5f38 + 8) =
                                               (uint)bVar16 * *(int *)(local_5f38 + 8) |
                                               (uint)!bVar16 * local_5e60._8_4_;
                                          *(uint *)(local_5f38 + 0xc) =
                                               (uint)bVar17 * *(int *)(local_5f38 + 0xc) |
                                               (uint)!bVar17 * local_5e60._12_4_;
                                          *(uint *)(local_5f38 + 0x10) =
                                               (uint)bVar18 * *(int *)(local_5f38 + 0x10) |
                                               (uint)!bVar18 * local_5e60._16_4_;
                                          *(uint *)(local_5f38 + 0x14) =
                                               (uint)bVar19 * *(int *)(local_5f38 + 0x14) |
                                               (uint)!bVar19 * local_5e60._20_4_;
                                          *(uint *)(local_5f38 + 0x18) =
                                               (uint)bVar20 * *(int *)(local_5f38 + 0x18) |
                                               (uint)!bVar20 * local_5e60._24_4_;
                                          *(uint *)(local_5f38 + 0x1c) =
                                               (uint)bVar21 * *(int *)(local_5f38 + 0x1c) |
                                               (uint)!bVar21 * local_5e60._28_4_;
                                          lVar64 = local_5f88;
                                          lVar58 = local_5f78;
                                        }
                                        bVar52 = bVar71 & ~(byte)uVar63;
                                      }
                                    }
                                  }
                                  local_5ec0 = auVar92;
                                  if (bVar52 == 0) break;
                                  puVar62 = puVar62 + 0x10;
                                  bVar73 = uVar74 < 3;
                                  uVar74 = uVar74 + 1;
                                } while (bVar73);
                                bVar59 = bVar59 & bVar52;
                                bVar73 = bVar59 == 0;
                                lVar60 = local_5db0;
                                uVar63 = local_5da8;
                                uVar74 = local_5f30;
                                puVar66 = local_5f68;
                                pauVar68 = local_5f70;
                              }
                            } while ((!bVar73) && (uVar63 = uVar63 - 1 & uVar63, uVar63 != 0));
                          }
                          lVar60 = local_5db8 + 1;
                        } while (lVar60 != local_5dc0);
                        bVar59 = ~bVar59;
                      }
                      bVar53 = bVar53 | bVar59;
                      if (bVar53 == 0xff) goto LAB_0088e097;
                      auVar77 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                      local_5b00._0_4_ =
                           (uint)(bVar53 & 1) * auVar77._0_4_ |
                           (uint)!(bool)(bVar53 & 1) * local_5b00._0_4_;
                      bVar73 = (bool)(bVar53 >> 1 & 1);
                      local_5b00._4_4_ =
                           (uint)bVar73 * auVar77._4_4_ | (uint)!bVar73 * local_5b00._4_4_;
                      bVar73 = (bool)(bVar53 >> 2 & 1);
                      local_5b00._8_4_ =
                           (uint)bVar73 * auVar77._8_4_ | (uint)!bVar73 * local_5b00._8_4_;
                      bVar73 = (bool)(bVar53 >> 3 & 1);
                      local_5b00._12_4_ =
                           (uint)bVar73 * auVar77._12_4_ | (uint)!bVar73 * local_5b00._12_4_;
                      bVar73 = (bool)(bVar53 >> 4 & 1);
                      local_5b00._16_4_ =
                           (uint)bVar73 * auVar77._16_4_ | (uint)!bVar73 * local_5b00._16_4_;
                      bVar73 = (bool)(bVar53 >> 5 & 1);
                      local_5b00._20_4_ =
                           (uint)bVar73 * auVar77._20_4_ | (uint)!bVar73 * local_5b00._20_4_;
                      bVar73 = (bool)(bVar53 >> 6 & 1);
                      local_5b00._24_4_ =
                           (uint)bVar73 * auVar77._24_4_ | (uint)!bVar73 * local_5b00._24_4_;
                      local_5b00._28_4_ =
                           (uint)(bVar53 >> 7) * auVar77._28_4_ |
                           (uint)!(bool)(bVar53 >> 7) * local_5b00._28_4_;
                      iVar55 = 0;
                      break;
                    }
                    goto LAB_0088e0a8;
                  }
                  auVar142 = ZEXT3264(auVar148._0_32_);
                  uVar69 = 0;
                  uVar63 = 8;
                  do {
                    uVar56 = *(ulong *)((root.ptr & 0xfffffffffffffff0) + uVar69 * 8);
                    if (uVar56 != 8) {
                      uVar70 = *(undefined4 *)(root.ptr + 0x40 + uVar69 * 4);
                      auVar110._4_4_ = uVar70;
                      auVar110._0_4_ = uVar70;
                      auVar110._8_4_ = uVar70;
                      auVar110._12_4_ = uVar70;
                      auVar110._16_4_ = uVar70;
                      auVar110._20_4_ = uVar70;
                      auVar110._24_4_ = uVar70;
                      auVar110._28_4_ = uVar70;
                      auVar45._8_8_ = local_5ca0._8_8_;
                      auVar45._0_8_ = local_5ca0._0_8_;
                      auVar45._16_8_ = local_5ca0._16_8_;
                      auVar45._24_8_ = local_5ca0._24_8_;
                      auVar46._8_8_ = local_5ca0._40_8_;
                      auVar46._0_8_ = local_5ca0._32_8_;
                      auVar46._16_8_ = local_5ca0._48_8_;
                      auVar46._24_8_ = local_5ca0._56_8_;
                      auVar47._8_8_ = local_5ca0._72_8_;
                      auVar47._0_8_ = local_5ca0._64_8_;
                      auVar47._16_8_ = local_5ca0._80_8_;
                      auVar47._24_8_ = local_5ca0._88_8_;
                      auVar77 = vsubps_avx(auVar110,auVar45);
                      auVar138._0_4_ = (float)local_5be0._0_4_ * auVar77._0_4_;
                      auVar138._4_4_ = (float)local_5be0._4_4_ * auVar77._4_4_;
                      auVar138._8_4_ = fStack_5bd8 * auVar77._8_4_;
                      auVar138._12_4_ = fStack_5bd4 * auVar77._12_4_;
                      auVar138._16_4_ = fStack_5bd0 * auVar77._16_4_;
                      auVar138._20_4_ = fStack_5bcc * auVar77._20_4_;
                      auVar138._28_36_ = auVar137._28_36_;
                      auVar138._24_4_ = fStack_5bc8 * auVar77._24_4_;
                      auVar94 = auVar138._0_32_;
                      auVar137 = ZEXT3264(auVar94);
                      uVar70 = *(undefined4 *)(root.ptr + 0x80 + uVar69 * 4);
                      auVar111._4_4_ = uVar70;
                      auVar111._0_4_ = uVar70;
                      auVar111._8_4_ = uVar70;
                      auVar111._12_4_ = uVar70;
                      auVar111._16_4_ = uVar70;
                      auVar111._20_4_ = uVar70;
                      auVar111._24_4_ = uVar70;
                      auVar111._28_4_ = uVar70;
                      auVar77 = vsubps_avx(auVar111,auVar46);
                      auVar140._0_4_ = (float)local_5bc0._0_4_ * auVar77._0_4_;
                      auVar140._4_4_ = (float)local_5bc0._4_4_ * auVar77._4_4_;
                      auVar140._8_4_ = fStack_5bb8 * auVar77._8_4_;
                      auVar140._12_4_ = fStack_5bb4 * auVar77._12_4_;
                      auVar140._16_4_ = fStack_5bb0 * auVar77._16_4_;
                      auVar140._20_4_ = fStack_5bac * auVar77._20_4_;
                      auVar140._28_36_ = auVar139._28_36_;
                      auVar140._24_4_ = fStack_5ba8 * auVar77._24_4_;
                      auVar95 = auVar140._0_32_;
                      auVar139 = ZEXT3264(auVar95);
                      uVar70 = *(undefined4 *)(root.ptr + 0xc0 + uVar69 * 4);
                      auVar112._4_4_ = uVar70;
                      auVar112._0_4_ = uVar70;
                      auVar112._8_4_ = uVar70;
                      auVar112._12_4_ = uVar70;
                      auVar112._16_4_ = uVar70;
                      auVar112._20_4_ = uVar70;
                      auVar112._24_4_ = uVar70;
                      auVar112._28_4_ = uVar70;
                      auVar77 = vsubps_avx(auVar112,auVar47);
                      auVar141._0_4_ = (float)local_5ba0._0_4_ * auVar77._0_4_;
                      auVar141._4_4_ = (float)local_5ba0._4_4_ * auVar77._4_4_;
                      auVar141._8_4_ = fStack_5b98 * auVar77._8_4_;
                      auVar141._12_4_ = fStack_5b94 * auVar77._12_4_;
                      auVar141._16_4_ = fStack_5b90 * auVar77._16_4_;
                      auVar141._20_4_ = fStack_5b8c * auVar77._20_4_;
                      auVar141._28_36_ = in_ZMM9._28_36_;
                      auVar141._24_4_ = fStack_5b88 * auVar77._24_4_;
                      auVar123 = auVar141._0_32_;
                      in_ZMM9 = ZEXT3264(auVar123);
                      uVar70 = *(undefined4 *)(root.ptr + 0x60 + uVar69 * 4);
                      auVar113._4_4_ = uVar70;
                      auVar113._0_4_ = uVar70;
                      auVar113._8_4_ = uVar70;
                      auVar113._12_4_ = uVar70;
                      auVar113._16_4_ = uVar70;
                      auVar113._20_4_ = uVar70;
                      auVar113._24_4_ = uVar70;
                      auVar113._28_4_ = uVar70;
                      auVar77 = vsubps_avx(auVar113,auVar45);
                      auVar32._4_4_ = (float)local_5be0._4_4_ * auVar77._4_4_;
                      auVar32._0_4_ = (float)local_5be0._0_4_ * auVar77._0_4_;
                      auVar32._8_4_ = fStack_5bd8 * auVar77._8_4_;
                      auVar32._12_4_ = fStack_5bd4 * auVar77._12_4_;
                      auVar32._16_4_ = fStack_5bd0 * auVar77._16_4_;
                      auVar32._20_4_ = fStack_5bcc * auVar77._20_4_;
                      auVar32._24_4_ = fStack_5bc8 * auVar77._24_4_;
                      auVar32._28_4_ = (int)((ulong)local_5ca0._24_8_ >> 0x20);
                      uVar70 = *(undefined4 *)(root.ptr + 0xa0 + uVar69 * 4);
                      auVar114._4_4_ = uVar70;
                      auVar114._0_4_ = uVar70;
                      auVar114._8_4_ = uVar70;
                      auVar114._12_4_ = uVar70;
                      auVar114._16_4_ = uVar70;
                      auVar114._20_4_ = uVar70;
                      auVar114._24_4_ = uVar70;
                      auVar114._28_4_ = uVar70;
                      auVar77 = vsubps_avx(auVar114,auVar46);
                      auVar33._4_4_ = (float)local_5bc0._4_4_ * auVar77._4_4_;
                      auVar33._0_4_ = (float)local_5bc0._0_4_ * auVar77._0_4_;
                      auVar33._8_4_ = fStack_5bb8 * auVar77._8_4_;
                      auVar33._12_4_ = fStack_5bb4 * auVar77._12_4_;
                      auVar33._16_4_ = fStack_5bb0 * auVar77._16_4_;
                      auVar33._20_4_ = fStack_5bac * auVar77._20_4_;
                      auVar33._24_4_ = fStack_5ba8 * auVar77._24_4_;
                      auVar33._28_4_ = (int)((ulong)local_5ca0._56_8_ >> 0x20);
                      uVar70 = *(undefined4 *)(root.ptr + 0xe0 + uVar69 * 4);
                      auVar115._4_4_ = uVar70;
                      auVar115._0_4_ = uVar70;
                      auVar115._8_4_ = uVar70;
                      auVar115._12_4_ = uVar70;
                      auVar115._16_4_ = uVar70;
                      auVar115._20_4_ = uVar70;
                      auVar115._24_4_ = uVar70;
                      auVar115._28_4_ = uVar70;
                      auVar77 = vsubps_avx(auVar115,auVar47);
                      auVar34._4_4_ = (float)local_5ba0._4_4_ * auVar77._4_4_;
                      auVar34._0_4_ = (float)local_5ba0._0_4_ * auVar77._0_4_;
                      auVar34._8_4_ = fStack_5b98 * auVar77._8_4_;
                      auVar34._12_4_ = fStack_5b94 * auVar77._12_4_;
                      auVar34._16_4_ = fStack_5b90 * auVar77._16_4_;
                      auVar34._20_4_ = fStack_5b8c * auVar77._20_4_;
                      auVar34._24_4_ = fStack_5b88 * auVar77._24_4_;
                      auVar34._28_4_ = (int)((ulong)local_5ca0._88_8_ >> 0x20);
                      auVar77 = vminps_avx(auVar94,auVar32);
                      auVar78 = vminps_avx(auVar95,auVar33);
                      auVar77 = vmaxps_avx(auVar77,auVar78);
                      auVar78 = vminps_avx(auVar123,auVar34);
                      auVar77 = vmaxps_avx(auVar77,auVar78);
                      auVar76 = vmulps_avx512vl(auVar77,auVar149._0_32_);
                      auVar77 = vmaxps_avx(auVar94,auVar32);
                      auVar78 = vmaxps_avx(auVar95,auVar33);
                      auVar78 = vminps_avx(auVar77,auVar78);
                      auVar77 = vmaxps_avx(auVar123,auVar34);
                      auVar77 = vminps_avx(auVar78,auVar77);
                      auVar78 = vmulps_avx512vl(auVar77,auVar150._0_32_);
                      auVar77 = vmaxps_avx(auVar76,local_5b20);
                      auVar78 = vminps_avx(auVar78,local_5b00);
                      uVar24 = vcmpps_avx512vl(auVar77,auVar78,2);
                      if ((byte)uVar24 != 0) {
                        auVar77 = vblendmps_avx512vl(auVar148._0_32_,auVar76);
                        bVar73 = (bool)((byte)uVar24 & 1);
                        bVar15 = (bool)((byte)(uVar24 >> 1) & 1);
                        bVar16 = (bool)((byte)(uVar24 >> 2) & 1);
                        bVar17 = (bool)((byte)(uVar24 >> 3) & 1);
                        bVar18 = (bool)((byte)(uVar24 >> 4) & 1);
                        bVar19 = (bool)((byte)(uVar24 >> 5) & 1);
                        bVar20 = (bool)((byte)(uVar24 >> 6) & 1);
                        bVar21 = SUB81(uVar24 >> 7,0);
                        if (uVar63 != 8) {
                          *puVar66 = uVar63;
                          puVar66 = puVar66 + 1;
                          *pauVar68 = auVar142._0_32_;
                          pauVar68 = pauVar68 + 1;
                        }
                        auVar142 = ZEXT3264(CONCAT428((uint)bVar21 * auVar77._28_4_ |
                                                      (uint)!bVar21 * auVar76._28_4_,
                                                      CONCAT424((uint)bVar20 * auVar77._24_4_ |
                                                                (uint)!bVar20 * auVar76._24_4_,
                                                                CONCAT420((uint)bVar19 *
                                                                          auVar77._20_4_ |
                                                                          (uint)!bVar19 *
                                                                          auVar76._20_4_,
                                                                          CONCAT416((uint)bVar18 *
                                                                                    auVar77._16_4_ |
                                                                                    (uint)!bVar18 *
                                                                                    auVar76._16_4_,
                                                                                    CONCAT412((uint)
                                                  bVar17 * auVar77._12_4_ |
                                                  (uint)!bVar17 * auVar76._12_4_,
                                                  CONCAT48((uint)bVar16 * auVar77._8_4_ |
                                                           (uint)!bVar16 * auVar76._8_4_,
                                                           CONCAT44((uint)bVar15 * auVar77._4_4_ |
                                                                    (uint)!bVar15 * auVar76._4_4_,
                                                                    (uint)bVar73 * auVar77._0_4_ |
                                                                    (uint)!bVar73 * auVar76._0_4_)))
                                                  )))));
                        uVar63 = uVar56;
                      }
                    }
                  } while ((uVar56 != 8) && (bVar73 = uVar69 < 7, uVar69 = uVar69 + 1, bVar73));
                  iVar55 = 0;
                  if (uVar63 == 8) {
LAB_0088ca9c:
                    bVar73 = false;
                    iVar55 = 4;
                  }
                  else {
                    uVar25 = vcmpps_avx512vl(auVar142._0_32_,local_5b00,9);
                    bVar73 = true;
                    if ((uint)POPCOUNT((int)uVar25) <= (uint)uVar74) {
                      *puVar66 = uVar63;
                      puVar66 = puVar66 + 1;
                      *pauVar68 = auVar142._0_32_;
                      pauVar68 = pauVar68 + 1;
                      goto LAB_0088ca9c;
                    }
                  }
                  root.ptr = uVar63;
                } while (bVar73);
              }
            }
          }
        } while (iVar55 != 3);
        bVar53 = bVar53 & (byte)local_5f24;
        bVar73 = (bool)(bVar53 >> 1 & 1);
        bVar15 = (bool)(bVar53 >> 2 & 1);
        bVar16 = (bool)(bVar53 >> 3 & 1);
        bVar17 = (bool)(bVar53 >> 4 & 1);
        bVar18 = (bool)(bVar53 >> 5 & 1);
        bVar19 = (bool)(bVar53 >> 6 & 1);
        *(uint *)local_5f38 =
             (uint)(bVar53 & 1) * -0x800000 | (uint)!(bool)(bVar53 & 1) * *(int *)local_5f38;
        *(uint *)(local_5f38 + 4) =
             (uint)bVar73 * -0x800000 | (uint)!bVar73 * *(int *)(local_5f38 + 4);
        *(uint *)(local_5f38 + 8) =
             (uint)bVar15 * -0x800000 | (uint)!bVar15 * *(int *)(local_5f38 + 8);
        *(uint *)(local_5f38 + 0xc) =
             (uint)bVar16 * -0x800000 | (uint)!bVar16 * *(int *)(local_5f38 + 0xc);
        *(uint *)(local_5f38 + 0x10) =
             (uint)bVar17 * -0x800000 | (uint)!bVar17 * *(int *)(local_5f38 + 0x10);
        *(uint *)(local_5f38 + 0x14) =
             (uint)bVar18 * -0x800000 | (uint)!bVar18 * *(int *)(local_5f38 + 0x14);
        *(uint *)(local_5f38 + 0x18) =
             (uint)bVar19 * -0x800000 | (uint)!bVar19 * *(int *)(local_5f38 + 0x18);
        *(uint *)(local_5f38 + 0x1c) =
             (uint)(bVar53 >> 7) * -0x800000 |
             (uint)!(bool)(bVar53 >> 7) * *(int *)(local_5f38 + 0x1c);
      }
    }
    else {
      occludedCoherent(valid_i,This,ray,context);
    }
  }
  return;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }